

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  byte bVar72;
  Geometry *geometry;
  long lVar73;
  ulong uVar74;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar82;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  bool bVar75;
  ulong uVar76;
  undefined8 unaff_R13;
  long lVar77;
  ulong uVar78;
  byte bVar79;
  ulong uVar80;
  float fVar81;
  float fVar130;
  float fVar131;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar87 [16];
  float fVar132;
  float fVar134;
  float fVar135;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar133;
  float fVar136;
  float fVar137;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar138;
  undefined4 uVar139;
  float fVar142;
  float fVar143;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined8 uVar144;
  undefined1 auVar145 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar165;
  float fVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  uint uVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5e0 [16];
  ulong local_5c8;
  undefined1 local_5c0 [16];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined1 local_590 [16];
  Geometry *local_580;
  Precalculations *local_578;
  RTCFilterFunctionNArguments local_570;
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  LinearSpace3fa *local_430;
  ulong local_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 local_2d0 [16];
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar90 [16];
  
  uVar78 = (ulong)(byte)prim[1];
  fVar150 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar22 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar23 = vsubps_avx(auVar85,*(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  fVar149 = fVar150 * auVar23._0_4_;
  fVar138 = fVar150 * auVar22._0_4_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar99 = vpmovsxbd_avx2(auVar85);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar95 = vpmovsxbd_avx2(auVar84);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar96 = vpmovsxbd_avx2(auVar89);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar97 = vpmovsxbd_avx2(auVar83);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar78 * 0xc + 6);
  auVar98 = vpmovsxbd_avx2(auVar9);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar78 * 0xd + 6);
  auVar100 = vpmovsxbd_avx2(auVar10);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar78 * 0x12 + 6);
  auVar108 = vpmovsxbd_avx2(auVar11);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar78 * 0x13 + 6);
  auVar107 = vpmovsxbd_avx2(auVar12);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar78 * 0x14 + 6);
  auVar102 = vpmovsxbd_avx2(auVar86);
  auVar101 = vcvtdq2ps_avx(auVar102);
  auVar178._4_4_ = fVar138;
  auVar178._0_4_ = fVar138;
  auVar178._8_4_ = fVar138;
  auVar178._12_4_ = fVar138;
  auVar178._16_4_ = fVar138;
  auVar178._20_4_ = fVar138;
  auVar178._24_4_ = fVar138;
  auVar178._28_4_ = fVar138;
  auVar181._8_4_ = 1;
  auVar181._0_8_ = 0x100000001;
  auVar181._12_4_ = 1;
  auVar181._16_4_ = 1;
  auVar181._20_4_ = 1;
  auVar181._24_4_ = 1;
  auVar181._28_4_ = 1;
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar94 = ZEXT1632(CONCAT412(fVar150 * auVar22._12_4_,
                               CONCAT48(fVar150 * auVar22._8_4_,
                                        CONCAT44(fVar150 * auVar22._4_4_,fVar138))));
  auVar93 = vpermps_avx2(auVar181,auVar94);
  auVar92 = vpermps_avx512vl(auVar91,auVar94);
  fVar138 = auVar92._0_4_;
  auVar190._0_4_ = fVar138 * auVar96._0_4_;
  fVar142 = auVar92._4_4_;
  auVar190._4_4_ = fVar142 * auVar96._4_4_;
  fVar143 = auVar92._8_4_;
  auVar190._8_4_ = fVar143 * auVar96._8_4_;
  fVar165 = auVar92._12_4_;
  auVar190._12_4_ = fVar165 * auVar96._12_4_;
  fVar166 = auVar92._16_4_;
  auVar190._16_4_ = fVar166 * auVar96._16_4_;
  fVar81 = auVar92._20_4_;
  auVar190._20_4_ = fVar81 * auVar96._20_4_;
  fVar82 = auVar92._24_4_;
  auVar190._28_36_ = in_ZMM4._28_36_;
  auVar190._24_4_ = fVar82 * auVar96._24_4_;
  auVar94._4_4_ = auVar100._4_4_ * fVar142;
  auVar94._0_4_ = auVar100._0_4_ * fVar138;
  auVar94._8_4_ = auVar100._8_4_ * fVar143;
  auVar94._12_4_ = auVar100._12_4_ * fVar165;
  auVar94._16_4_ = auVar100._16_4_ * fVar166;
  auVar94._20_4_ = auVar100._20_4_ * fVar81;
  auVar94._24_4_ = auVar100._24_4_ * fVar82;
  auVar94._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar101._4_4_ * fVar142;
  auVar102._0_4_ = auVar101._0_4_ * fVar138;
  auVar102._8_4_ = auVar101._8_4_ * fVar143;
  auVar102._12_4_ = auVar101._12_4_ * fVar165;
  auVar102._16_4_ = auVar101._16_4_ * fVar166;
  auVar102._20_4_ = auVar101._20_4_ * fVar81;
  auVar102._24_4_ = auVar101._24_4_ * fVar82;
  auVar102._28_4_ = auVar92._28_4_;
  auVar85 = vfmadd231ps_fma(auVar190._0_32_,auVar93,auVar95);
  auVar84 = vfmadd231ps_fma(auVar94,auVar93,auVar98);
  auVar89 = vfmadd231ps_fma(auVar102,auVar107,auVar93);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar178,auVar99);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar178,auVar97);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar108,auVar178);
  auVar179._4_4_ = fVar149;
  auVar179._0_4_ = fVar149;
  auVar179._8_4_ = fVar149;
  auVar179._12_4_ = fVar149;
  auVar179._16_4_ = fVar149;
  auVar179._20_4_ = fVar149;
  auVar179._24_4_ = fVar149;
  auVar179._28_4_ = fVar149;
  auVar93 = ZEXT1632(CONCAT412(fVar150 * auVar23._12_4_,
                               CONCAT48(fVar150 * auVar23._8_4_,
                                        CONCAT44(fVar150 * auVar23._4_4_,fVar149))));
  auVar102 = vpermps_avx2(auVar181,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  auVar94 = vmulps_avx512vl(auVar93,auVar96);
  auVar104._0_4_ = auVar93._0_4_ * auVar100._0_4_;
  auVar104._4_4_ = auVar93._4_4_ * auVar100._4_4_;
  auVar104._8_4_ = auVar93._8_4_ * auVar100._8_4_;
  auVar104._12_4_ = auVar93._12_4_ * auVar100._12_4_;
  auVar104._16_4_ = auVar93._16_4_ * auVar100._16_4_;
  auVar104._20_4_ = auVar93._20_4_ * auVar100._20_4_;
  auVar104._24_4_ = auVar93._24_4_ * auVar100._24_4_;
  auVar104._28_4_ = 0;
  auVar100._4_4_ = auVar93._4_4_ * auVar101._4_4_;
  auVar100._0_4_ = auVar93._0_4_ * auVar101._0_4_;
  auVar100._8_4_ = auVar93._8_4_ * auVar101._8_4_;
  auVar100._12_4_ = auVar93._12_4_ * auVar101._12_4_;
  auVar100._16_4_ = auVar93._16_4_ * auVar101._16_4_;
  auVar100._20_4_ = auVar93._20_4_ * auVar101._20_4_;
  auVar100._24_4_ = auVar93._24_4_ * auVar101._24_4_;
  auVar100._28_4_ = auVar96._28_4_;
  auVar95 = vfmadd231ps_avx512vl(auVar94,auVar102,auVar95);
  auVar83 = vfmadd231ps_fma(auVar104,auVar102,auVar98);
  auVar9 = vfmadd231ps_fma(auVar100,auVar102,auVar107);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar179,auVar99);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar179,auVar97);
  auVar168._8_4_ = 0x7fffffff;
  auVar168._0_8_ = 0x7fffffff7fffffff;
  auVar168._12_4_ = 0x7fffffff;
  auVar168._16_4_ = 0x7fffffff;
  auVar168._20_4_ = 0x7fffffff;
  auVar168._24_4_ = 0x7fffffff;
  auVar168._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar179,auVar108);
  auVar99 = vandps_avx(ZEXT1632(auVar85),auVar168);
  auVar106._8_4_ = 0x219392ef;
  auVar106._0_8_ = 0x219392ef219392ef;
  auVar106._12_4_ = 0x219392ef;
  auVar106._16_4_ = 0x219392ef;
  auVar106._20_4_ = 0x219392ef;
  auVar106._24_4_ = 0x219392ef;
  auVar106._28_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar99,auVar106,1);
  bVar75 = (bool)((byte)uVar80 & 1);
  auVar93._0_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar85._0_4_;
  bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar85._4_4_;
  bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar85._8_4_;
  bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar85._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar84),auVar168);
  uVar80 = vcmpps_avx512vl(auVar99,auVar106,1);
  bVar75 = (bool)((byte)uVar80 & 1);
  auVar91._0_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar84._0_4_;
  bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar84._4_4_;
  bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar84._8_4_;
  bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar84._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar89),auVar168);
  uVar80 = vcmpps_avx512vl(auVar99,auVar106,1);
  bVar75 = (bool)((byte)uVar80 & 1);
  auVar99._0_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar89._0_4_;
  bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar89._4_4_;
  bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar89._8_4_;
  bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar89._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar93);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar98 = vfnmadd213ps_avx512vl(auVar93,auVar96,auVar97);
  auVar85 = vfmadd132ps_fma(auVar98,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar91);
  auVar98 = vfnmadd213ps_avx512vl(auVar91,auVar96,auVar97);
  auVar84 = vfmadd132ps_fma(auVar98,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar99);
  auVar99 = vfnmadd213ps_avx512vl(auVar99,auVar96,auVar97);
  auVar89 = vfmadd132ps_fma(auVar99,auVar96,auVar96);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx512vl(auVar99,auVar95);
  auVar108._4_4_ = auVar85._4_4_ * auVar99._4_4_;
  auVar108._0_4_ = auVar85._0_4_ * auVar99._0_4_;
  auVar108._8_4_ = auVar85._8_4_ * auVar99._8_4_;
  auVar108._12_4_ = auVar85._12_4_ * auVar99._12_4_;
  auVar108._16_4_ = auVar99._16_4_ * 0.0;
  auVar108._20_4_ = auVar99._20_4_ * 0.0;
  auVar108._24_4_ = auVar99._24_4_ * 0.0;
  auVar108._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx512vl(auVar99,auVar95);
  auVar105._0_4_ = auVar85._0_4_ * auVar99._0_4_;
  auVar105._4_4_ = auVar85._4_4_ * auVar99._4_4_;
  auVar105._8_4_ = auVar85._8_4_ * auVar99._8_4_;
  auVar105._12_4_ = auVar85._12_4_ * auVar99._12_4_;
  auVar105._16_4_ = auVar99._16_4_ * 0.0;
  auVar105._20_4_ = auVar99._20_4_ * 0.0;
  auVar105._24_4_ = auVar99._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0xe + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar83));
  auVar107._4_4_ = auVar84._4_4_ * auVar99._4_4_;
  auVar107._0_4_ = auVar84._0_4_ * auVar99._0_4_;
  auVar107._8_4_ = auVar84._8_4_ * auVar99._8_4_;
  auVar107._12_4_ = auVar84._12_4_ * auVar99._12_4_;
  auVar107._16_4_ = auVar99._16_4_ * 0.0;
  auVar107._20_4_ = auVar99._20_4_ * 0.0;
  auVar107._24_4_ = auVar99._24_4_ * 0.0;
  auVar107._28_4_ = auVar99._28_4_;
  auVar100 = vpbroadcastd_avx512vl();
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar83));
  auVar103._0_4_ = auVar84._0_4_ * auVar99._0_4_;
  auVar103._4_4_ = auVar84._4_4_ * auVar99._4_4_;
  auVar103._8_4_ = auVar84._8_4_ * auVar99._8_4_;
  auVar103._12_4_ = auVar84._12_4_ * auVar99._12_4_;
  auVar103._16_4_ = auVar99._16_4_ * 0.0;
  auVar103._20_4_ = auVar99._20_4_ * 0.0;
  auVar103._24_4_ = auVar99._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x15 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar9));
  auVar101._4_4_ = auVar99._4_4_ * auVar89._4_4_;
  auVar101._0_4_ = auVar99._0_4_ * auVar89._0_4_;
  auVar101._8_4_ = auVar99._8_4_ * auVar89._8_4_;
  auVar101._12_4_ = auVar99._12_4_ * auVar89._12_4_;
  auVar101._16_4_ = auVar99._16_4_ * 0.0;
  auVar101._20_4_ = auVar99._20_4_ * 0.0;
  auVar101._24_4_ = auVar99._24_4_ * 0.0;
  auVar101._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x17 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar9));
  auVar92._0_4_ = auVar89._0_4_ * auVar99._0_4_;
  auVar92._4_4_ = auVar89._4_4_ * auVar99._4_4_;
  auVar92._8_4_ = auVar89._8_4_ * auVar99._8_4_;
  auVar92._12_4_ = auVar89._12_4_ * auVar99._12_4_;
  auVar92._16_4_ = auVar99._16_4_ * 0.0;
  auVar92._20_4_ = auVar99._20_4_ * 0.0;
  auVar92._24_4_ = auVar99._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar99 = vpminsd_avx2(auVar108,auVar105);
  auVar95 = vpminsd_avx2(auVar107,auVar103);
  auVar99 = vmaxps_avx(auVar99,auVar95);
  auVar95 = vpminsd_avx2(auVar101,auVar92);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar96._4_4_ = uVar139;
  auVar96._0_4_ = uVar139;
  auVar96._8_4_ = uVar139;
  auVar96._12_4_ = uVar139;
  auVar96._16_4_ = uVar139;
  auVar96._20_4_ = uVar139;
  auVar96._24_4_ = uVar139;
  auVar96._28_4_ = uVar139;
  auVar95 = vmaxps_avx512vl(auVar95,auVar96);
  auVar99 = vmaxps_avx(auVar99,auVar95);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  auVar95._16_4_ = 0x3f7ffffa;
  auVar95._20_4_ = 0x3f7ffffa;
  auVar95._24_4_ = 0x3f7ffffa;
  auVar95._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar99,auVar95);
  auVar99 = vpmaxsd_avx2(auVar108,auVar105);
  auVar95 = vpmaxsd_avx2(auVar107,auVar103);
  auVar99 = vminps_avx(auVar99,auVar95);
  auVar95 = vpmaxsd_avx2(auVar101,auVar92);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar97._4_4_ = uVar139;
  auVar97._0_4_ = uVar139;
  auVar97._8_4_ = uVar139;
  auVar97._12_4_ = uVar139;
  auVar97._16_4_ = uVar139;
  auVar97._20_4_ = uVar139;
  auVar97._24_4_ = uVar139;
  auVar97._28_4_ = uVar139;
  auVar95 = vminps_avx512vl(auVar95,auVar97);
  auVar99 = vminps_avx(auVar99,auVar95);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar99 = vmulps_avx512vl(auVar99,auVar98);
  uVar144 = vcmpps_avx512vl(local_80,auVar99,2);
  uVar24 = vpcmpgtd_avx512vl(auVar100,_DAT_01fb4ba0);
  local_428 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar144 & (byte)uVar24));
  local_430 = pre->ray_space + k;
  local_3a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_578 = pre;
  while (local_428 != 0) {
    lVar77 = 0;
    for (uVar80 = local_428; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      lVar77 = lVar77 + 1;
    }
    local_5c8 = (ulong)*(uint *)(prim + 2);
    pGVar14 = (context->scene->geometries).items[local_5c8].ptr;
    uVar80 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                             pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)*(uint *)(prim + lVar77 * 4 + 6));
    p_Var15 = pGVar14[1].intersectionFilterN;
    lVar77 = *(long *)&pGVar14[1].time_range.upper;
    local_5c0 = *(undefined1 (*) [16])(lVar77 + (long)p_Var15 * uVar80);
    pauVar4 = (undefined1 (*) [16])(lVar77 + (uVar80 + 1) * (long)p_Var15);
    local_5a0 = *(undefined8 *)*pauVar4;
    uStack_598 = *(undefined8 *)(*pauVar4 + 8);
    auVar85 = *pauVar4;
    pauVar5 = (undefined1 (*) [16])(lVar77 + (uVar80 + 2) * (long)p_Var15);
    local_5b0 = *(undefined8 *)*pauVar5;
    uStack_5a8 = *(undefined8 *)(*pauVar5 + 8);
    auVar84 = *pauVar5;
    uVar78 = local_428 - 1 & local_428;
    pauVar6 = (undefined1 (*) [12])(lVar77 + (uVar80 + 3) * (long)p_Var15);
    local_4f0 = (float)*(undefined8 *)*pauVar6;
    fStack_4ec = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
    fStack_4e8 = (float)*(undefined8 *)(*pauVar6 + 8);
    fStack_4e4 = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
    if (uVar78 != 0) {
      uVar76 = uVar78 - 1 & uVar78;
      for (uVar80 = uVar78; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      }
      if (uVar76 != 0) {
        for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar9 = vsubps_avx(local_5c0,auVar89);
    uVar139 = auVar9._0_4_;
    auVar146._4_4_ = uVar139;
    auVar146._0_4_ = uVar139;
    auVar146._8_4_ = uVar139;
    auVar146._12_4_ = uVar139;
    auVar83 = vshufps_avx(auVar9,auVar9,0x55);
    auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
    aVar7 = (local_430->vx).field_0;
    aVar8 = (local_430->vy).field_0;
    fVar150 = (local_430->vz).field_0.m128[0];
    fVar138 = *(float *)((long)&(local_430->vz).field_0 + 4);
    fVar142 = *(float *)((long)&(local_430->vz).field_0 + 8);
    fVar143 = *(float *)((long)&(local_430->vz).field_0 + 0xc);
    auVar170._0_4_ = fVar150 * auVar9._0_4_;
    auVar170._4_4_ = fVar138 * auVar9._4_4_;
    auVar170._8_4_ = fVar142 * auVar9._8_4_;
    auVar170._12_4_ = fVar143 * auVar9._12_4_;
    auVar83 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar8,auVar83);
    auVar11 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar7,auVar146);
    auVar83 = vshufps_avx(local_5c0,local_5c0,0xff);
    auVar10 = vsubps_avx(auVar85,auVar89);
    uVar139 = auVar10._0_4_;
    auVar87._4_4_ = uVar139;
    auVar87._0_4_ = uVar139;
    auVar87._8_4_ = uVar139;
    auVar87._12_4_ = uVar139;
    auVar9 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar171._0_4_ = fVar150 * auVar10._0_4_;
    auVar171._4_4_ = fVar138 * auVar10._4_4_;
    auVar171._8_4_ = fVar142 * auVar10._8_4_;
    auVar171._12_4_ = fVar143 * auVar10._12_4_;
    auVar9 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar8,auVar9);
    auVar12 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar7,auVar87);
    auVar85 = vshufps_avx(auVar85,auVar85,0xff);
    auVar10 = vsubps_avx(auVar84,auVar89);
    uVar139 = auVar10._0_4_;
    auVar167._4_4_ = uVar139;
    auVar167._0_4_ = uVar139;
    auVar167._8_4_ = uVar139;
    auVar167._12_4_ = uVar139;
    auVar9 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar175._0_4_ = fVar150 * auVar10._0_4_;
    auVar175._4_4_ = fVar138 * auVar10._4_4_;
    auVar175._8_4_ = fVar142 * auVar10._8_4_;
    auVar175._12_4_ = fVar143 * auVar10._12_4_;
    auVar9 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar8,auVar9);
    auVar10 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar7,auVar167);
    auVar84 = vshufps_avx(auVar84,auVar84,0xff);
    auVar22._12_4_ = fStack_4e4;
    auVar22._0_12_ = *pauVar6;
    auVar9 = vsubps_avx(auVar22,auVar89);
    uVar139 = auVar9._0_4_;
    auVar151._4_4_ = uVar139;
    auVar151._0_4_ = uVar139;
    auVar151._8_4_ = uVar139;
    auVar151._12_4_ = uVar139;
    auVar89 = vshufps_avx(auVar9,auVar9,0x55);
    auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar177._0_4_ = fVar150 * auVar9._0_4_;
    auVar177._4_4_ = fVar138 * auVar9._4_4_;
    auVar177._8_4_ = fVar142 * auVar9._8_4_;
    auVar177._12_4_ = fVar143 * auVar9._12_4_;
    auVar89 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar8,auVar89);
    auVar9 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar7,auVar151);
    auVar89 = vshufps_avx(auVar22,auVar22,0xff);
    lVar77 = (long)iVar13 * 0x44;
    auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar77);
    local_3c0 = vbroadcastss_avx512vl(auVar11);
    auVar158._8_4_ = 1;
    auVar158._0_8_ = 0x100000001;
    auVar158._12_4_ = 1;
    auVar158._16_4_ = 1;
    auVar158._20_4_ = 1;
    auVar158._24_4_ = 1;
    auVar158._28_4_ = 1;
    local_3e0 = vpermps_avx512vl(auVar158,ZEXT1632(auVar11));
    uVar144 = auVar83._0_8_;
    local_a0._8_8_ = uVar144;
    local_a0._0_8_ = uVar144;
    local_a0._16_8_ = uVar144;
    local_a0._24_8_ = uVar144;
    auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar77 + 0x484);
    local_400 = vbroadcastss_avx512vl(auVar12);
    local_4e0 = vpermps_avx2(auVar158,ZEXT1632(auVar12));
    uVar144 = auVar85._0_8_;
    local_c0._8_8_ = uVar144;
    local_c0._0_8_ = uVar144;
    local_c0._16_8_ = uVar144;
    local_c0._24_8_ = uVar144;
    auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar77 + 0x908);
    uVar139 = auVar10._0_4_;
    auVar147._4_4_ = uVar139;
    auVar147._0_4_ = uVar139;
    auVar147._8_4_ = uVar139;
    auVar147._12_4_ = uVar139;
    local_540._16_4_ = uVar139;
    local_540._0_16_ = auVar147;
    local_540._20_4_ = uVar139;
    local_540._24_4_ = uVar139;
    local_540._28_4_ = uVar139;
    local_4c0 = vpermps_avx512vl(auVar158,ZEXT1632(auVar10));
    local_e0 = vbroadcastsd_avx512vl(auVar84);
    auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar77 + 0xd8c);
    local_480 = vbroadcastss_avx512vl(auVar9);
    auVar190 = ZEXT3264(local_480);
    local_4a0 = vpermps_avx512vl(auVar158,ZEXT1632(auVar9));
    auVar191 = ZEXT3264(local_4a0);
    _local_100 = vbroadcastsd_avx512vl(auVar89);
    auVar98 = vmulps_avx512vl(local_480,auVar97);
    auVar100 = vmulps_avx512vl(local_4a0,auVar97);
    auVar85 = vfmadd231ps_fma(auVar98,auVar96,local_540);
    auVar98 = vfmadd231ps_avx512vl(auVar100,auVar96,local_4c0);
    auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar95,local_400);
    auVar85 = vfmadd231ps_fma(auVar98,auVar95,local_4e0);
    auVar101 = vfmadd231ps_avx512vl(auVar100,auVar99,local_3c0);
    auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar99,local_3e0);
    auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar77);
    auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar77 + 0x484);
    auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar77 + 0x908);
    auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar77 + 0xd8c);
    auVar93 = vmulps_avx512vl(local_480,auVar107);
    auVar94 = vmulps_avx512vl(local_4a0,auVar107);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar108,local_540);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar108,local_4c0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,local_400);
    auVar193 = ZEXT3264(local_4e0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_4e0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_3c0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar98,local_3e0);
    auVar91 = vsubps_avx512vl(auVar93,auVar101);
    auVar92 = vsubps_avx512vl(auVar94,auVar102);
    auVar103 = vmulps_avx512vl(auVar102,auVar91);
    auVar104 = vmulps_avx512vl(auVar101,auVar92);
    auVar103 = vsubps_avx512vl(auVar103,auVar104);
    auVar104 = vmulps_avx512vl(_local_100,auVar97);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,local_e0);
    auVar85 = vfmadd231ps_fma(auVar104,auVar95,local_c0);
    auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar99,local_a0);
    auVar105 = vmulps_avx512vl(_local_100,auVar107);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,local_e0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,local_c0);
    auVar89 = vfmadd231ps_fma(auVar105,auVar98,local_a0);
    auVar105 = vmulps_avx512vl(auVar92,auVar92);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar91,auVar91);
    auVar106 = vmaxps_avx512vl(auVar104,ZEXT1632(auVar89));
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar105 = vmulps_avx512vl(auVar106,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    uVar144 = vcmpps_avx512vl(auVar103,auVar105,2);
    auVar85 = vblendps_avx(auVar11,local_5c0,8);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar84 = vandps_avx512vl(auVar85,auVar83);
    auVar85 = vblendps_avx(auVar12,*pauVar4,8);
    auVar85 = vandps_avx512vl(auVar85,auVar83);
    auVar84 = vmaxps_avx(auVar84,auVar85);
    auVar85 = vblendps_avx(auVar10,*pauVar5,8);
    auVar86 = vandps_avx512vl(auVar85,auVar83);
    auVar23._12_4_ = fStack_4e4;
    auVar23._0_12_ = *pauVar6;
    auVar85 = vblendps_avx(auVar9,auVar23,8);
    auVar85 = vandps_avx512vl(auVar85,auVar83);
    auVar85 = vmaxps_avx(auVar86,auVar85);
    auVar85 = vmaxps_avx(auVar84,auVar85);
    auVar84 = vmovshdup_avx(auVar85);
    auVar84 = vmaxss_avx(auVar84,auVar85);
    auVar85 = vshufpd_avx(auVar85,auVar85,1);
    local_500._0_4_ = (undefined4)iVar13;
    local_500._4_12_ = auVar11._4_12_;
    auVar85 = vmaxss_avx(auVar85,auVar84);
    auVar176._4_4_ = local_500._0_4_;
    auVar176._0_4_ = local_500._0_4_;
    auVar176._8_4_ = local_500._0_4_;
    auVar176._12_4_ = local_500._0_4_;
    auVar176._16_4_ = local_500._0_4_;
    auVar176._20_4_ = local_500._0_4_;
    auVar176._24_4_ = local_500._0_4_;
    auVar176._28_4_ = local_500._0_4_;
    uVar24 = vcmpps_avx512vl(auVar176,_DAT_01f7b060,0xe);
    bVar79 = (byte)uVar144 & (byte)uVar24;
    local_2a0 = auVar85._0_4_ * 4.7683716e-07;
    auVar156._8_4_ = 2;
    auVar156._0_8_ = 0x200000002;
    auVar156._12_4_ = 2;
    auVar156._16_4_ = 2;
    auVar156._20_4_ = 2;
    auVar156._24_4_ = 2;
    auVar156._28_4_ = 2;
    local_120 = vpermps_avx512vl(auVar156,ZEXT1632(auVar11));
    local_140 = vpermps_avx512vl(auVar156,ZEXT1632(auVar12));
    local_160 = vpermps_avx512vl(auVar156,ZEXT1632(auVar10));
    local_460 = vpermps_avx2(auVar156,ZEXT1632(auVar9));
    uVar174 = *(uint *)(ray + k * 4 + 0x30);
    local_390 = vpbroadcastd_avx512vl();
    auVar85 = ZEXT416((uint)local_2a0);
    if (bVar79 == 0) {
      bVar75 = false;
      auVar85 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
      auVar185 = ZEXT1664(auVar85);
      auVar186 = ZEXT3264(local_3c0);
      auVar187 = ZEXT3264(local_3e0);
      auVar188 = ZEXT3264(local_400);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar192 = ZEXT3264(auVar99);
      auVar184 = ZEXT3264(local_540);
      auVar189 = ZEXT3264(local_4c0);
    }
    else {
      local_420._0_16_ = ZEXT416(uVar174);
      auVar107 = vmulps_avx512vl(local_460,auVar107);
      auVar108 = vfmadd213ps_avx512vl(auVar108,local_160,auVar107);
      auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar108);
      auVar100 = vfmadd213ps_avx512vl(auVar98,local_120,auVar100);
      auVar97 = vmulps_avx512vl(local_460,auVar97);
      auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar97);
      auVar108 = vfmadd213ps_avx512vl(auVar95,local_140,auVar96);
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar77 + 0x1210);
      auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar77 + 0x1694);
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar77 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar77 + 0x1f9c);
      auVar108 = vfmadd213ps_avx512vl(auVar99,local_120,auVar108);
      auVar99 = vmulps_avx512vl(local_480,auVar98);
      auVar107 = vmulps_avx512vl(local_4a0,auVar98);
      auVar98 = vmulps_avx512vl(local_460,auVar98);
      auVar84 = vfmadd231ps_fma(auVar99,auVar97,local_540);
      auVar99 = vfmadd231ps_avx512vl(auVar107,auVar97,local_4c0);
      auVar97 = vfmadd231ps_avx512vl(auVar98,local_160,auVar97);
      auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar96,local_400);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_4e0);
      auVar107 = vfmadd231ps_avx512vl(auVar97,local_140,auVar96);
      auVar84 = vfmadd231ps_fma(auVar98,auVar95,local_3c0);
      auVar98 = vfmadd231ps_avx512vl(auVar99,auVar95,local_3e0);
      auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar77 + 0x1210);
      auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar77 + 0x1b18);
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar77 + 0x1f9c);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_120,auVar95);
      auVar95 = vmulps_avx512vl(local_480,auVar97);
      auVar103 = vmulps_avx512vl(local_4a0,auVar97);
      auVar97 = vmulps_avx512vl(local_460,auVar97);
      auVar105 = vfmadd231ps_avx512vl(auVar95,auVar96,local_540);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,local_4c0);
      auVar96 = vfmadd231ps_avx512vl(auVar97,local_160,auVar96);
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar77 + 0x1694);
      auVar97 = vfmadd231ps_avx512vl(auVar105,auVar95,local_400);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,local_4e0);
      auVar95 = vfmadd231ps_avx512vl(auVar96,local_140,auVar95);
      auVar83 = vfmadd231ps_fma(auVar97,auVar99,local_3c0);
      auVar96 = vfmadd231ps_avx512vl(auVar103,auVar99,local_3e0);
      auVar97 = vfmadd231ps_avx512vl(auVar95,local_120,auVar99);
      auVar182._8_4_ = 0x7fffffff;
      auVar182._0_8_ = 0x7fffffff7fffffff;
      auVar182._12_4_ = 0x7fffffff;
      auVar182._16_4_ = 0x7fffffff;
      auVar182._20_4_ = 0x7fffffff;
      auVar182._24_4_ = 0x7fffffff;
      auVar182._28_4_ = 0x7fffffff;
      auVar99 = vandps_avx(ZEXT1632(auVar84),auVar182);
      auVar95 = vandps_avx(auVar98,auVar182);
      auVar95 = vmaxps_avx(auVar99,auVar95);
      auVar99 = vandps_avx(auVar107,auVar182);
      auVar99 = vmaxps_avx(auVar95,auVar99);
      auVar107 = vbroadcastss_avx512vl(auVar85);
      uVar80 = vcmpps_avx512vl(auVar99,auVar107,1);
      bVar75 = (bool)((byte)uVar80 & 1);
      auVar109._0_4_ = (float)((uint)bVar75 * auVar91._0_4_ | (uint)!bVar75 * auVar84._0_4_);
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar75 * auVar91._4_4_ | (uint)!bVar75 * auVar84._4_4_);
      bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar75 * auVar91._8_4_ | (uint)!bVar75 * auVar84._8_4_);
      bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar75 * auVar91._12_4_ | (uint)!bVar75 * auVar84._12_4_);
      fVar138 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar91._16_4_);
      auVar109._16_4_ = fVar138;
      fVar150 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar91._20_4_);
      auVar109._20_4_ = fVar150;
      fVar142 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar91._24_4_);
      auVar109._24_4_ = fVar142;
      uVar1 = (uint)(byte)(uVar80 >> 7) * auVar91._28_4_;
      auVar109._28_4_ = uVar1;
      bVar75 = (bool)((byte)uVar80 & 1);
      auVar110._0_4_ = (float)((uint)bVar75 * auVar92._0_4_ | (uint)!bVar75 * auVar98._0_4_);
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar75 * auVar92._4_4_ | (uint)!bVar75 * auVar98._4_4_);
      bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar75 * auVar92._8_4_ | (uint)!bVar75 * auVar98._8_4_);
      bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar75 * auVar92._12_4_ | (uint)!bVar75 * auVar98._12_4_);
      bVar75 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar75 * auVar92._16_4_ | (uint)!bVar75 * auVar98._16_4_);
      bVar75 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar75 * auVar92._20_4_ | (uint)!bVar75 * auVar98._20_4_);
      bVar75 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar75 * auVar92._24_4_ | (uint)!bVar75 * auVar98._24_4_);
      bVar75 = SUB81(uVar80 >> 7,0);
      auVar110._28_4_ = (uint)bVar75 * auVar92._28_4_ | (uint)!bVar75 * auVar98._28_4_;
      auVar99 = vandps_avx(auVar182,ZEXT1632(auVar83));
      auVar95 = vandps_avx(auVar96,auVar182);
      auVar95 = vmaxps_avx(auVar99,auVar95);
      auVar99 = vandps_avx(auVar97,auVar182);
      auVar99 = vmaxps_avx(auVar95,auVar99);
      uVar80 = vcmpps_avx512vl(auVar99,auVar107,1);
      bVar75 = (bool)((byte)uVar80 & 1);
      auVar111._0_4_ = (float)((uint)bVar75 * auVar91._0_4_ | (uint)!bVar75 * auVar83._0_4_);
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar75 * auVar91._4_4_ | (uint)!bVar75 * auVar83._4_4_);
      bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar75 * auVar91._8_4_ | (uint)!bVar75 * auVar83._8_4_);
      bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar75 * auVar91._12_4_ | (uint)!bVar75 * auVar83._12_4_);
      fVar143 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar91._16_4_);
      auVar111._16_4_ = fVar143;
      fVar165 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar91._20_4_);
      auVar111._20_4_ = fVar165;
      fVar166 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar91._24_4_);
      auVar111._24_4_ = fVar166;
      auVar111._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar91._28_4_;
      bVar75 = (bool)((byte)uVar80 & 1);
      auVar112._0_4_ = (float)((uint)bVar75 * auVar92._0_4_ | (uint)!bVar75 * auVar96._0_4_);
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar75 * auVar92._4_4_ | (uint)!bVar75 * auVar96._4_4_);
      bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar75 * auVar92._8_4_ | (uint)!bVar75 * auVar96._8_4_);
      bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar75 * auVar92._12_4_ | (uint)!bVar75 * auVar96._12_4_);
      bVar75 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar75 * auVar92._16_4_ | (uint)!bVar75 * auVar96._16_4_);
      bVar75 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar75 * auVar92._20_4_ | (uint)!bVar75 * auVar96._20_4_);
      bVar75 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar75 * auVar92._24_4_ | (uint)!bVar75 * auVar96._24_4_);
      bVar75 = SUB81(uVar80 >> 7,0);
      auVar112._28_4_ = (uint)bVar75 * auVar92._28_4_ | (uint)!bVar75 * auVar96._28_4_;
      auVar87 = vxorps_avx512vl(auVar147,auVar147);
      auVar185 = ZEXT1664(auVar87);
      auVar99 = vfmadd213ps_avx512vl(auVar109,auVar109,ZEXT1632(auVar87));
      auVar84 = vfmadd231ps_fma(auVar99,auVar110,auVar110);
      auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar81 = auVar99._0_4_;
      fVar82 = auVar99._4_4_;
      fVar149 = auVar99._8_4_;
      fVar130 = auVar99._12_4_;
      fVar131 = auVar99._16_4_;
      fVar132 = auVar99._20_4_;
      fVar134 = auVar99._24_4_;
      auVar32._4_4_ = fVar82 * fVar82 * fVar82 * auVar84._4_4_ * -0.5;
      auVar32._0_4_ = fVar81 * fVar81 * fVar81 * auVar84._0_4_ * -0.5;
      auVar32._8_4_ = fVar149 * fVar149 * fVar149 * auVar84._8_4_ * -0.5;
      auVar32._12_4_ = fVar130 * fVar130 * fVar130 * auVar84._12_4_ * -0.5;
      auVar32._16_4_ = fVar131 * fVar131 * fVar131 * -0.0;
      auVar32._20_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar32._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar32._28_4_ = 0;
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar96 = vfmadd231ps_avx512vl(auVar32,auVar95,auVar99);
      auVar33._4_4_ = auVar110._4_4_ * auVar96._4_4_;
      auVar33._0_4_ = auVar110._0_4_ * auVar96._0_4_;
      auVar33._8_4_ = auVar110._8_4_ * auVar96._8_4_;
      auVar33._12_4_ = auVar110._12_4_ * auVar96._12_4_;
      auVar33._16_4_ = auVar110._16_4_ * auVar96._16_4_;
      auVar33._20_4_ = auVar110._20_4_ * auVar96._20_4_;
      auVar33._24_4_ = auVar110._24_4_ * auVar96._24_4_;
      auVar33._28_4_ = auVar99._28_4_;
      auVar34._4_4_ = auVar96._4_4_ * -auVar109._4_4_;
      auVar34._0_4_ = auVar96._0_4_ * -auVar109._0_4_;
      auVar34._8_4_ = auVar96._8_4_ * -auVar109._8_4_;
      auVar34._12_4_ = auVar96._12_4_ * -auVar109._12_4_;
      auVar34._16_4_ = auVar96._16_4_ * -fVar138;
      auVar34._20_4_ = auVar96._20_4_ * -fVar150;
      auVar34._24_4_ = auVar96._24_4_ * -fVar142;
      auVar34._28_4_ = uVar1 ^ 0x80000000;
      auVar99 = vmulps_avx512vl(auVar96,ZEXT1632(auVar87));
      auVar91 = ZEXT1632(auVar87);
      auVar97 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar91);
      auVar84 = vfmadd231ps_fma(auVar97,auVar112,auVar112);
      auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar150 = auVar97._0_4_;
      fVar138 = auVar97._4_4_;
      fVar142 = auVar97._8_4_;
      fVar81 = auVar97._12_4_;
      fVar82 = auVar97._16_4_;
      fVar149 = auVar97._20_4_;
      fVar130 = auVar97._24_4_;
      auVar35._4_4_ = fVar138 * fVar138 * fVar138 * auVar84._4_4_ * -0.5;
      auVar35._0_4_ = fVar150 * fVar150 * fVar150 * auVar84._0_4_ * -0.5;
      auVar35._8_4_ = fVar142 * fVar142 * fVar142 * auVar84._8_4_ * -0.5;
      auVar35._12_4_ = fVar81 * fVar81 * fVar81 * auVar84._12_4_ * -0.5;
      auVar35._16_4_ = fVar82 * fVar82 * fVar82 * -0.0;
      auVar35._20_4_ = fVar149 * fVar149 * fVar149 * -0.0;
      auVar35._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar35._28_4_ = 0;
      auVar95 = vfmadd231ps_avx512vl(auVar35,auVar95,auVar97);
      auVar36._4_4_ = auVar112._4_4_ * auVar95._4_4_;
      auVar36._0_4_ = auVar112._0_4_ * auVar95._0_4_;
      auVar36._8_4_ = auVar112._8_4_ * auVar95._8_4_;
      auVar36._12_4_ = auVar112._12_4_ * auVar95._12_4_;
      auVar36._16_4_ = auVar112._16_4_ * auVar95._16_4_;
      auVar36._20_4_ = auVar112._20_4_ * auVar95._20_4_;
      auVar36._24_4_ = auVar112._24_4_ * auVar95._24_4_;
      auVar36._28_4_ = auVar97._28_4_;
      auVar37._4_4_ = -auVar111._4_4_ * auVar95._4_4_;
      auVar37._0_4_ = -auVar111._0_4_ * auVar95._0_4_;
      auVar37._8_4_ = -auVar111._8_4_ * auVar95._8_4_;
      auVar37._12_4_ = -auVar111._12_4_ * auVar95._12_4_;
      auVar37._16_4_ = -fVar143 * auVar95._16_4_;
      auVar37._20_4_ = -fVar165 * auVar95._20_4_;
      auVar37._24_4_ = -fVar166 * auVar95._24_4_;
      auVar37._28_4_ = auVar96._28_4_;
      auVar95 = vmulps_avx512vl(auVar95,auVar91);
      auVar84 = vfmadd213ps_fma(auVar33,auVar104,auVar101);
      auVar83 = vfmadd213ps_fma(auVar34,auVar104,auVar102);
      auVar96 = vfmadd213ps_avx512vl(auVar99,auVar104,auVar108);
      auVar97 = vfmadd213ps_avx512vl(auVar36,ZEXT1632(auVar89),auVar93);
      auVar86 = vfnmadd213ps_fma(auVar33,auVar104,auVar101);
      auVar107 = ZEXT1632(auVar89);
      auVar9 = vfmadd213ps_fma(auVar37,auVar107,auVar94);
      auVar22 = vfnmadd213ps_fma(auVar34,auVar104,auVar102);
      auVar10 = vfmadd213ps_fma(auVar95,auVar107,auVar100);
      auVar98 = vfnmadd231ps_avx512vl(auVar108,auVar104,auVar99);
      auVar23 = vfnmadd213ps_fma(auVar36,auVar107,auVar93);
      auVar146 = vfnmadd213ps_fma(auVar37,auVar107,auVar94);
      auVar147 = vfnmadd231ps_fma(auVar100,ZEXT1632(auVar89),auVar95);
      auVar95 = vsubps_avx512vl(auVar97,ZEXT1632(auVar86));
      auVar99 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar22));
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar10),auVar98);
      auVar108 = vmulps_avx512vl(auVar99,auVar98);
      auVar11 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar22),auVar100);
      auVar38._4_4_ = auVar86._4_4_ * auVar100._4_4_;
      auVar38._0_4_ = auVar86._0_4_ * auVar100._0_4_;
      auVar38._8_4_ = auVar86._8_4_ * auVar100._8_4_;
      auVar38._12_4_ = auVar86._12_4_ * auVar100._12_4_;
      auVar38._16_4_ = auVar100._16_4_ * 0.0;
      auVar38._20_4_ = auVar100._20_4_ * 0.0;
      auVar38._24_4_ = auVar100._24_4_ * 0.0;
      auVar38._28_4_ = auVar100._28_4_;
      auVar100 = vfmsub231ps_avx512vl(auVar38,auVar98,auVar95);
      auVar39._4_4_ = auVar22._4_4_ * auVar95._4_4_;
      auVar39._0_4_ = auVar22._0_4_ * auVar95._0_4_;
      auVar39._8_4_ = auVar22._8_4_ * auVar95._8_4_;
      auVar39._12_4_ = auVar22._12_4_ * auVar95._12_4_;
      auVar39._16_4_ = auVar95._16_4_ * 0.0;
      auVar39._20_4_ = auVar95._20_4_ * 0.0;
      auVar39._24_4_ = auVar95._24_4_ * 0.0;
      auVar39._28_4_ = auVar95._28_4_;
      auVar12 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar86),auVar99);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar12),auVar91,auVar100);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar11));
      auVar94 = ZEXT1632(auVar87);
      uVar80 = vcmpps_avx512vl(auVar99,auVar94,2);
      bVar72 = (byte)uVar80;
      fVar81 = (float)((uint)(bVar72 & 1) * auVar84._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar23._0_4_);
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      fVar149 = (float)((uint)bVar75 * auVar84._4_4_ | (uint)!bVar75 * auVar23._4_4_);
      bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
      fVar131 = (float)((uint)bVar75 * auVar84._8_4_ | (uint)!bVar75 * auVar23._8_4_);
      bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
      fVar134 = (float)((uint)bVar75 * auVar84._12_4_ | (uint)!bVar75 * auVar23._12_4_);
      auVar108 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar131,CONCAT44(fVar149,fVar81))));
      fVar82 = (float)((uint)(bVar72 & 1) * auVar83._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar146._0_4_);
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      fVar130 = (float)((uint)bVar75 * auVar83._4_4_ | (uint)!bVar75 * auVar146._4_4_);
      bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
      fVar132 = (float)((uint)bVar75 * auVar83._8_4_ | (uint)!bVar75 * auVar146._8_4_);
      bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
      fVar135 = (float)((uint)bVar75 * auVar83._12_4_ | (uint)!bVar75 * auVar146._12_4_);
      auVar107 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(fVar130,fVar82))));
      auVar113._0_4_ =
           (float)((uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar147._0_4_);
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar75 * auVar96._4_4_ | (uint)!bVar75 * auVar147._4_4_);
      bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar75 * auVar96._8_4_ | (uint)!bVar75 * auVar147._8_4_);
      bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar75 * auVar96._12_4_ | (uint)!bVar75 * auVar147._12_4_);
      fVar150 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar96._16_4_);
      auVar113._16_4_ = fVar150;
      fVar138 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar96._20_4_);
      auVar113._20_4_ = fVar138;
      fVar142 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar96._24_4_);
      auVar113._24_4_ = fVar142;
      iVar2 = (uint)(byte)(uVar80 >> 7) * auVar96._28_4_;
      auVar113._28_4_ = iVar2;
      auVar95 = vblendmps_avx512vl(ZEXT1632(auVar86),auVar97);
      auVar114._0_4_ =
           (uint)(bVar72 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar83._0_4_;
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar75 * auVar95._4_4_ | (uint)!bVar75 * auVar83._4_4_;
      bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar75 * auVar95._8_4_ | (uint)!bVar75 * auVar83._8_4_;
      bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar75 * auVar95._12_4_ | (uint)!bVar75 * auVar83._12_4_;
      auVar114._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar95._16_4_;
      auVar114._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar95._20_4_;
      auVar114._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar95._24_4_;
      auVar114._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar95._28_4_;
      auVar95 = vblendmps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar9));
      auVar115._0_4_ =
           (float)((uint)(bVar72 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar11._0_4_);
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar75 * auVar95._4_4_ | (uint)!bVar75 * auVar11._4_4_);
      bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar75 * auVar95._8_4_ | (uint)!bVar75 * auVar11._8_4_);
      bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar75 * auVar95._12_4_ | (uint)!bVar75 * auVar11._12_4_);
      fVar166 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar95._16_4_);
      auVar115._16_4_ = fVar166;
      fVar165 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar95._20_4_);
      auVar115._20_4_ = fVar165;
      fVar143 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar95._24_4_);
      auVar115._24_4_ = fVar143;
      auVar115._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar95._28_4_;
      auVar95 = vblendmps_avx512vl(auVar98,ZEXT1632(auVar10));
      auVar116._0_4_ =
           (float)((uint)(bVar72 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar96._0_4_);
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar75 * auVar95._4_4_ | (uint)!bVar75 * auVar96._4_4_);
      bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar75 * auVar95._8_4_ | (uint)!bVar75 * auVar96._8_4_);
      bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar75 * auVar95._12_4_ | (uint)!bVar75 * auVar96._12_4_);
      bVar75 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar116._16_4_ = (float)((uint)bVar75 * auVar95._16_4_ | (uint)!bVar75 * auVar96._16_4_);
      bVar75 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar116._20_4_ = (float)((uint)bVar75 * auVar95._20_4_ | (uint)!bVar75 * auVar96._20_4_);
      bVar75 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar116._24_4_ = (float)((uint)bVar75 * auVar95._24_4_ | (uint)!bVar75 * auVar96._24_4_);
      bVar75 = SUB81(uVar80 >> 7,0);
      auVar116._28_4_ = (uint)bVar75 * auVar95._28_4_ | (uint)!bVar75 * auVar96._28_4_;
      auVar117._0_4_ =
           (uint)(bVar72 & 1) * (int)auVar86._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar97._0_4_;
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar75 * (int)auVar86._4_4_ | (uint)!bVar75 * auVar97._4_4_;
      bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar75 * (int)auVar86._8_4_ | (uint)!bVar75 * auVar97._8_4_;
      bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar75 * (int)auVar86._12_4_ | (uint)!bVar75 * auVar97._12_4_;
      auVar117._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar97._16_4_;
      auVar117._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar97._20_4_;
      auVar117._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar97._24_4_;
      auVar117._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar97._28_4_;
      bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar118._0_4_ =
           (uint)(bVar72 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar10._0_4_;
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar10._4_4_;
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar10._8_4_;
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar10._12_4_;
      auVar118._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar98._16_4_;
      auVar118._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar98._20_4_;
      auVar118._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar98._24_4_;
      iVar3 = (uint)(byte)(uVar80 >> 7) * auVar98._28_4_;
      auVar118._28_4_ = iVar3;
      auVar101 = vsubps_avx512vl(auVar117,auVar108);
      auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar22._12_4_ |
                                              (uint)!bVar19 * auVar9._12_4_,
                                              CONCAT48((uint)bVar17 * (int)auVar22._8_4_ |
                                                       (uint)!bVar17 * auVar9._8_4_,
                                                       CONCAT44((uint)bVar75 * (int)auVar22._4_4_ |
                                                                (uint)!bVar75 * auVar9._4_4_,
                                                                (uint)(bVar72 & 1) *
                                                                (int)auVar22._0_4_ |
                                                                (uint)!(bool)(bVar72 & 1) *
                                                                auVar9._0_4_)))),auVar107);
      auVar96 = vsubps_avx(auVar118,auVar113);
      auVar97 = vsubps_avx(auVar108,auVar114);
      auVar98 = vsubps_avx(auVar107,auVar115);
      auVar100 = vsubps_avx(auVar113,auVar116);
      auVar40._4_4_ = auVar96._4_4_ * fVar149;
      auVar40._0_4_ = auVar96._0_4_ * fVar81;
      auVar40._8_4_ = auVar96._8_4_ * fVar131;
      auVar40._12_4_ = auVar96._12_4_ * fVar134;
      auVar40._16_4_ = auVar96._16_4_ * 0.0;
      auVar40._20_4_ = auVar96._20_4_ * 0.0;
      auVar40._24_4_ = auVar96._24_4_ * 0.0;
      auVar40._28_4_ = iVar3;
      auVar84 = vfmsub231ps_fma(auVar40,auVar113,auVar101);
      auVar41._4_4_ = fVar130 * auVar101._4_4_;
      auVar41._0_4_ = fVar82 * auVar101._0_4_;
      auVar41._8_4_ = fVar132 * auVar101._8_4_;
      auVar41._12_4_ = fVar135 * auVar101._12_4_;
      auVar41._16_4_ = auVar101._16_4_ * 0.0;
      auVar41._20_4_ = auVar101._20_4_ * 0.0;
      auVar41._24_4_ = auVar101._24_4_ * 0.0;
      auVar41._28_4_ = auVar99._28_4_;
      auVar83 = vfmsub231ps_fma(auVar41,auVar108,auVar95);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar94,ZEXT1632(auVar84));
      auVar159._0_4_ = auVar95._0_4_ * auVar113._0_4_;
      auVar159._4_4_ = auVar95._4_4_ * auVar113._4_4_;
      auVar159._8_4_ = auVar95._8_4_ * auVar113._8_4_;
      auVar159._12_4_ = auVar95._12_4_ * auVar113._12_4_;
      auVar159._16_4_ = auVar95._16_4_ * fVar150;
      auVar159._20_4_ = auVar95._20_4_ * fVar138;
      auVar159._24_4_ = auVar95._24_4_ * fVar142;
      auVar159._28_4_ = 0;
      auVar84 = vfmsub231ps_fma(auVar159,auVar107,auVar96);
      auVar102 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar84));
      auVar99 = vmulps_avx512vl(auVar100,auVar114);
      auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar116);
      auVar42._4_4_ = auVar98._4_4_ * auVar116._4_4_;
      auVar42._0_4_ = auVar98._0_4_ * auVar116._0_4_;
      auVar42._8_4_ = auVar98._8_4_ * auVar116._8_4_;
      auVar42._12_4_ = auVar98._12_4_ * auVar116._12_4_;
      auVar42._16_4_ = auVar98._16_4_ * auVar116._16_4_;
      auVar42._20_4_ = auVar98._20_4_ * auVar116._20_4_;
      auVar42._24_4_ = auVar98._24_4_ * auVar116._24_4_;
      auVar42._28_4_ = auVar116._28_4_;
      auVar84 = vfmsub231ps_fma(auVar42,auVar115,auVar100);
      auVar160._0_4_ = auVar115._0_4_ * auVar97._0_4_;
      auVar160._4_4_ = auVar115._4_4_ * auVar97._4_4_;
      auVar160._8_4_ = auVar115._8_4_ * auVar97._8_4_;
      auVar160._12_4_ = auVar115._12_4_ * auVar97._12_4_;
      auVar160._16_4_ = fVar166 * auVar97._16_4_;
      auVar160._20_4_ = fVar165 * auVar97._20_4_;
      auVar160._24_4_ = fVar143 * auVar97._24_4_;
      auVar160._28_4_ = 0;
      auVar83 = vfmsub231ps_fma(auVar160,auVar98,auVar114);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar94,auVar99);
      auVar93 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar84));
      auVar99 = vmaxps_avx(auVar102,auVar93);
      uVar144 = vcmpps_avx512vl(auVar99,auVar94,2);
      bVar79 = bVar79 & (byte)uVar144;
      auVar186 = ZEXT3264(local_3c0);
      auVar187 = ZEXT3264(local_3e0);
      auVar188 = ZEXT3264(local_400);
      auVar184 = ZEXT3264(local_540);
      auVar180 = ZEXT1664(auVar85);
      if (bVar79 == 0) {
        bVar75 = false;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar192 = ZEXT3264(auVar99);
        auVar189 = ZEXT3264(local_4c0);
        auVar190 = ZEXT3264(local_480);
        auVar191 = ZEXT3264(local_4a0);
      }
      else {
        auVar43._4_4_ = auVar100._4_4_ * auVar95._4_4_;
        auVar43._0_4_ = auVar100._0_4_ * auVar95._0_4_;
        auVar43._8_4_ = auVar100._8_4_ * auVar95._8_4_;
        auVar43._12_4_ = auVar100._12_4_ * auVar95._12_4_;
        auVar43._16_4_ = auVar100._16_4_ * auVar95._16_4_;
        auVar43._20_4_ = auVar100._20_4_ * auVar95._20_4_;
        auVar43._24_4_ = auVar100._24_4_ * auVar95._24_4_;
        auVar43._28_4_ = auVar99._28_4_;
        auVar9 = vfmsub231ps_fma(auVar43,auVar98,auVar96);
        auVar44._4_4_ = auVar96._4_4_ * auVar97._4_4_;
        auVar44._0_4_ = auVar96._0_4_ * auVar97._0_4_;
        auVar44._8_4_ = auVar96._8_4_ * auVar97._8_4_;
        auVar44._12_4_ = auVar96._12_4_ * auVar97._12_4_;
        auVar44._16_4_ = auVar96._16_4_ * auVar97._16_4_;
        auVar44._20_4_ = auVar96._20_4_ * auVar97._20_4_;
        auVar44._24_4_ = auVar96._24_4_ * auVar97._24_4_;
        auVar44._28_4_ = auVar96._28_4_;
        auVar83 = vfmsub231ps_fma(auVar44,auVar101,auVar100);
        auVar45._4_4_ = auVar98._4_4_ * auVar101._4_4_;
        auVar45._0_4_ = auVar98._0_4_ * auVar101._0_4_;
        auVar45._8_4_ = auVar98._8_4_ * auVar101._8_4_;
        auVar45._12_4_ = auVar98._12_4_ * auVar101._12_4_;
        auVar45._16_4_ = auVar98._16_4_ * auVar101._16_4_;
        auVar45._20_4_ = auVar98._20_4_ * auVar101._20_4_;
        auVar45._24_4_ = auVar98._24_4_ * auVar101._24_4_;
        auVar45._28_4_ = auVar98._28_4_;
        auVar10 = vfmsub231ps_fma(auVar45,auVar97,auVar95);
        auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar83),ZEXT1632(auVar10));
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar9),auVar94);
        auVar95 = vrcp14ps_avx512vl(auVar99);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar192 = ZEXT3264(auVar96);
        auVar97 = vfnmadd213ps_avx512vl(auVar95,auVar99,auVar96);
        auVar84 = vfmadd132ps_fma(auVar97,auVar95,auVar95);
        auVar46._4_4_ = auVar10._4_4_ * auVar113._4_4_;
        auVar46._0_4_ = auVar10._0_4_ * auVar113._0_4_;
        auVar46._8_4_ = auVar10._8_4_ * auVar113._8_4_;
        auVar46._12_4_ = auVar10._12_4_ * auVar113._12_4_;
        auVar46._16_4_ = fVar150 * 0.0;
        auVar46._20_4_ = fVar138 * 0.0;
        auVar46._24_4_ = fVar142 * 0.0;
        auVar46._28_4_ = iVar2;
        auVar83 = vfmadd231ps_fma(auVar46,auVar107,ZEXT1632(auVar83));
        auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar108,ZEXT1632(auVar9));
        fVar150 = auVar84._0_4_;
        fVar138 = auVar84._4_4_;
        fVar142 = auVar84._8_4_;
        fVar143 = auVar84._12_4_;
        local_240 = ZEXT1632(CONCAT412(auVar83._12_4_ * fVar143,
                                       CONCAT48(auVar83._8_4_ * fVar142,
                                                CONCAT44(auVar83._4_4_ * fVar138,
                                                         auVar83._0_4_ * fVar150))));
        auVar169._4_4_ = uVar174;
        auVar169._0_4_ = uVar174;
        auVar169._8_4_ = uVar174;
        auVar169._12_4_ = uVar174;
        auVar169._16_4_ = uVar174;
        auVar169._20_4_ = uVar174;
        auVar169._24_4_ = uVar174;
        auVar169._28_4_ = uVar174;
        uVar144 = vcmpps_avx512vl(auVar169,local_240,2);
        uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar25._4_4_ = uVar139;
        auVar25._0_4_ = uVar139;
        auVar25._8_4_ = uVar139;
        auVar25._12_4_ = uVar139;
        auVar25._16_4_ = uVar139;
        auVar25._20_4_ = uVar139;
        auVar25._24_4_ = uVar139;
        auVar25._28_4_ = uVar139;
        uVar24 = vcmpps_avx512vl(local_240,auVar25,2);
        bVar79 = (byte)uVar144 & (byte)uVar24 & bVar79;
        auVar190 = ZEXT3264(local_480);
        auVar191 = ZEXT3264(local_4a0);
        if (bVar79 == 0) {
          bVar75 = false;
          auVar189 = ZEXT3264(local_4c0);
        }
        else {
          uVar144 = vcmpps_avx512vl(auVar99,auVar94,4);
          bVar79 = bVar79 & (byte)uVar144;
          auVar173 = ZEXT1664(local_5c0);
          auVar189 = ZEXT3264(local_4c0);
          if (bVar79 != 0) {
            fVar165 = auVar102._0_4_ * fVar150;
            fVar166 = auVar102._4_4_ * fVar138;
            auVar47._4_4_ = fVar166;
            auVar47._0_4_ = fVar165;
            fVar81 = auVar102._8_4_ * fVar142;
            auVar47._8_4_ = fVar81;
            fVar82 = auVar102._12_4_ * fVar143;
            auVar47._12_4_ = fVar82;
            fVar149 = auVar102._16_4_ * 0.0;
            auVar47._16_4_ = fVar149;
            fVar130 = auVar102._20_4_ * 0.0;
            auVar47._20_4_ = fVar130;
            fVar131 = auVar102._24_4_ * 0.0;
            auVar47._24_4_ = fVar131;
            auVar47._28_4_ = auVar99._28_4_;
            auVar95 = vsubps_avx512vl(auVar96,auVar47);
            local_280._0_4_ =
                 (float)((uint)(bVar72 & 1) * (int)fVar165 |
                        (uint)!(bool)(bVar72 & 1) * auVar95._0_4_);
            bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar75 * (int)fVar166 | (uint)!bVar75 * auVar95._4_4_);
            bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar75 * (int)fVar81 | (uint)!bVar75 * auVar95._8_4_);
            bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar75 * (int)fVar82 | (uint)!bVar75 * auVar95._12_4_);
            bVar75 = (bool)((byte)(uVar80 >> 4) & 1);
            local_280._16_4_ = (float)((uint)bVar75 * (int)fVar149 | (uint)!bVar75 * auVar95._16_4_)
            ;
            bVar75 = (bool)((byte)(uVar80 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar75 * (int)fVar130 | (uint)!bVar75 * auVar95._20_4_)
            ;
            bVar75 = (bool)((byte)(uVar80 >> 6) & 1);
            local_280._24_4_ = (float)((uint)bVar75 * (int)fVar131 | (uint)!bVar75 * auVar95._24_4_)
            ;
            bVar75 = SUB81(uVar80 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar75 * auVar99._28_4_ | (uint)!bVar75 * auVar95._28_4_);
            auVar99 = vsubps_avx(ZEXT1632(auVar89),auVar104);
            auVar84 = vfmadd213ps_fma(auVar99,local_280,auVar104);
            uVar139 = *(undefined4 *)((long)local_578->ray_space + k * 4 + -0x10);
            auVar26._4_4_ = uVar139;
            auVar26._0_4_ = uVar139;
            auVar26._8_4_ = uVar139;
            auVar26._12_4_ = uVar139;
            auVar26._16_4_ = uVar139;
            auVar26._20_4_ = uVar139;
            auVar26._24_4_ = uVar139;
            auVar26._28_4_ = uVar139;
            auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                                         CONCAT48(auVar84._8_4_ + auVar84._8_4_,
                                                                  CONCAT44(auVar84._4_4_ +
                                                                           auVar84._4_4_,
                                                                           auVar84._0_4_ +
                                                                           auVar84._0_4_)))),auVar26
                                     );
            uVar144 = vcmpps_avx512vl(local_240,auVar99,6);
            if (((byte)uVar144 & bVar79) != 0) {
              auVar148._0_4_ = auVar93._0_4_ * fVar150;
              auVar148._4_4_ = auVar93._4_4_ * fVar138;
              auVar148._8_4_ = auVar93._8_4_ * fVar142;
              auVar148._12_4_ = auVar93._12_4_ * fVar143;
              auVar148._16_4_ = auVar93._16_4_ * 0.0;
              auVar148._20_4_ = auVar93._20_4_ * 0.0;
              auVar148._24_4_ = auVar93._24_4_ * 0.0;
              auVar148._28_4_ = 0;
              auVar99 = vsubps_avx512vl(auVar96,auVar148);
              auVar119._0_4_ =
                   (uint)(bVar72 & 1) * (int)auVar148._0_4_ |
                   (uint)!(bool)(bVar72 & 1) * auVar99._0_4_;
              bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
              auVar119._4_4_ = (uint)bVar75 * (int)auVar148._4_4_ | (uint)!bVar75 * auVar99._4_4_;
              bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
              auVar119._8_4_ = (uint)bVar75 * (int)auVar148._8_4_ | (uint)!bVar75 * auVar99._8_4_;
              bVar75 = (bool)((byte)(uVar80 >> 3) & 1);
              auVar119._12_4_ = (uint)bVar75 * (int)auVar148._12_4_ | (uint)!bVar75 * auVar99._12_4_
              ;
              bVar75 = (bool)((byte)(uVar80 >> 4) & 1);
              auVar119._16_4_ = (uint)bVar75 * (int)auVar148._16_4_ | (uint)!bVar75 * auVar99._16_4_
              ;
              bVar75 = (bool)((byte)(uVar80 >> 5) & 1);
              auVar119._20_4_ = (uint)bVar75 * (int)auVar148._20_4_ | (uint)!bVar75 * auVar99._20_4_
              ;
              bVar75 = (bool)((byte)(uVar80 >> 6) & 1);
              auVar119._24_4_ = (uint)bVar75 * (int)auVar148._24_4_ | (uint)!bVar75 * auVar99._24_4_
              ;
              auVar119._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar99._28_4_;
              auVar27._8_4_ = 0x40000000;
              auVar27._0_8_ = 0x4000000040000000;
              auVar27._12_4_ = 0x40000000;
              auVar27._16_4_ = 0x40000000;
              auVar27._20_4_ = 0x40000000;
              auVar27._24_4_ = 0x40000000;
              auVar27._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar119,auVar96,auVar27);
              local_220 = 0;
              if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar75 = true, pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01a54dac;
                fVar150 = 1.0 / (float)local_500._0_4_;
                local_1c0[0] = fVar150 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar150 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar150 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar150 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar150 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar150 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar150 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                lVar73 = 0;
                uVar76 = (ulong)((byte)uVar144 & bVar79);
                for (uVar80 = uVar76; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000)
                {
                  lVar73 = lVar73 + 1;
                }
                local_510 = vpbroadcastd_avx512vl();
                local_590 = auVar85;
                local_21c = iVar13;
                local_210 = local_5c0;
                local_200 = local_5a0;
                uStack_1f8 = uStack_598;
                local_1f0 = local_5b0;
                uStack_1e8 = uStack_5a8;
                while( true ) {
                  local_2a0 = auVar180._0_4_;
                  auVar85 = auVar185._0_16_;
                  if (uVar76 == 0) break;
                  local_380 = *(float *)(ray + k * 4 + 0x80);
                  fVar150 = local_1c0[lVar73];
                  local_300._4_4_ = fVar150;
                  local_300._0_4_ = fVar150;
                  local_300._8_4_ = fVar150;
                  local_300._12_4_ = fVar150;
                  local_2a0 = (float)lVar73;
                  fStack_29c = (float)((ulong)lVar73 >> 0x20);
                  local_2f0 = *(undefined4 *)(local_1a0 + lVar73 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + lVar73 * 4);
                  local_570.context = context->user;
                  fVar138 = 1.0 - fVar150;
                  auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(fVar150 * (fVar138 + fVar138))),
                                            ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
                  auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_300,
                                            ZEXT416(0xc0a00000));
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * 3.0)),
                                            ZEXT416((uint)(fVar150 + fVar150)),auVar84);
                  auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_300,
                                            ZEXT416(0x40000000));
                  auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138 * -3.0)),
                                            ZEXT416((uint)(fVar138 + fVar138)),auVar84);
                  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),local_300,
                                            ZEXT416((uint)(fVar138 * -2.0)));
                  fVar150 = auVar9._0_4_ * 0.5;
                  fVar138 = auVar89._0_4_ * 0.5;
                  fVar142 = auVar84._0_4_ * 0.5;
                  fVar143 = auVar83._0_4_ * 0.5;
                  auVar152._0_4_ = fVar143 * local_4f0;
                  auVar152._4_4_ = fVar143 * fStack_4ec;
                  auVar152._8_4_ = fVar143 * fStack_4e8;
                  auVar152._12_4_ = fVar143 * fStack_4e4;
                  auVar163._4_4_ = fVar142;
                  auVar163._0_4_ = fVar142;
                  auVar163._8_4_ = fVar142;
                  auVar163._12_4_ = fVar142;
                  auVar66._8_8_ = uStack_5a8;
                  auVar66._0_8_ = local_5b0;
                  auVar84 = vfmadd132ps_fma(auVar163,auVar152,auVar66);
                  auVar153._4_4_ = fVar138;
                  auVar153._0_4_ = fVar138;
                  auVar153._8_4_ = fVar138;
                  auVar153._12_4_ = fVar138;
                  auVar68._8_8_ = uStack_598;
                  auVar68._0_8_ = local_5a0;
                  auVar84 = vfmadd132ps_fma(auVar153,auVar84,auVar68);
                  auVar140._4_4_ = fVar150;
                  auVar140._0_4_ = fVar150;
                  auVar140._8_4_ = fVar150;
                  auVar140._12_4_ = fVar150;
                  auVar84 = vfmadd213ps_fma(auVar140,auVar173._0_16_,auVar84);
                  local_330 = auVar84._0_4_;
                  local_320 = vshufps_avx(auVar84,auVar84,0x55);
                  local_310 = vshufps_avx(auVar84,auVar84,0xaa);
                  local_2e0 = local_390._0_8_;
                  uStack_2d8 = local_390._8_8_;
                  local_2d0 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_2bc = (local_570.context)->instID[0];
                  local_2c0 = uStack_2bc;
                  uStack_2b8 = uStack_2bc;
                  uStack_2b4 = uStack_2bc;
                  uStack_2b0 = (local_570.context)->instPrimID[0];
                  uStack_2ac = uStack_2b0;
                  uStack_2a8 = uStack_2b0;
                  uStack_2a4 = uStack_2b0;
                  local_5e0 = local_3a0;
                  local_570.valid = (int *)local_5e0;
                  local_570.geometryUserPtr = pGVar14->userPtr;
                  local_570.hit = (RTCHitN *)&local_330;
                  local_570.N = 4;
                  local_360 = (uint)uVar76;
                  uStack_35c = (uint)(uVar76 >> 0x20);
                  local_570.ray = (RTCRayN *)ray;
                  uStack_32c = local_330;
                  uStack_328 = local_330;
                  uStack_324 = local_330;
                  uStack_2ec = local_2f0;
                  uStack_2e8 = local_2f0;
                  uStack_2e4 = local_2f0;
                  if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar14->occlusionFilterN)(&local_570);
                    uVar76 = CONCAT44(uStack_35c,local_360);
                    auVar180 = ZEXT1664(local_590);
                    auVar191 = ZEXT3264(local_4a0);
                    auVar190 = ZEXT3264(local_480);
                    auVar189 = ZEXT3264(local_4c0);
                    auVar184 = ZEXT3264(local_540);
                    auVar193 = ZEXT3264(local_4e0);
                    auVar188 = ZEXT3264(local_400);
                    auVar187 = ZEXT3264(local_3e0);
                    auVar186 = ZEXT3264(local_3c0);
                    auVar173 = ZEXT1664(local_5c0);
                    auVar85 = vxorps_avx512vl(auVar85,auVar85);
                    auVar185 = ZEXT1664(auVar85);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar192 = ZEXT3264(auVar99);
                    uVar174 = local_420._0_4_;
                  }
                  auVar85 = auVar185._0_16_;
                  uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                  if ((uVar80 & 0xf) != 0) {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_570);
                      uVar76 = CONCAT44(uStack_35c,local_360);
                      auVar180 = ZEXT1664(local_590);
                      auVar191 = ZEXT3264(local_4a0);
                      auVar190 = ZEXT3264(local_480);
                      auVar189 = ZEXT3264(local_4c0);
                      auVar184 = ZEXT3264(local_540);
                      auVar193 = ZEXT3264(local_4e0);
                      auVar188 = ZEXT3264(local_400);
                      auVar187 = ZEXT3264(local_3e0);
                      auVar186 = ZEXT3264(local_3c0);
                      auVar173 = ZEXT1664(local_5c0);
                      auVar85 = vxorps_avx512vl(auVar85,auVar85);
                      auVar185 = ZEXT1664(auVar85);
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar192 = ZEXT3264(auVar99);
                      uVar174 = local_420._0_4_;
                    }
                    auVar85 = *(undefined1 (*) [16])(local_570.ray + 0x80);
                    uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                    uVar80 = uVar80 & 0xf;
                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar75 = (bool)((byte)uVar80 & 1);
                    auVar88._0_4_ = (uint)bVar75 * auVar84._0_4_ | (uint)!bVar75 * auVar85._0_4_;
                    bVar75 = (bool)((byte)(uVar80 >> 1) & 1);
                    auVar88._4_4_ = (uint)bVar75 * auVar84._4_4_ | (uint)!bVar75 * auVar85._4_4_;
                    bVar75 = (bool)((byte)(uVar80 >> 2) & 1);
                    auVar88._8_4_ = (uint)bVar75 * auVar84._8_4_ | (uint)!bVar75 * auVar85._8_4_;
                    bVar75 = SUB81(uVar80 >> 3,0);
                    auVar88._12_4_ = (uint)bVar75 * auVar84._12_4_ | (uint)!bVar75 * auVar85._12_4_;
                    *(undefined1 (*) [16])(local_570.ray + 0x80) = auVar88;
                    if ((byte)uVar80 != 0) {
                      bVar75 = true;
                      local_2a0 = auVar180._0_4_;
                      goto LAB_01a54dac;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = local_380;
                  lVar73 = 0;
                  uVar76 = uVar76 ^ 1L << ((ulong)(uint)local_2a0 & 0x3f);
                  for (uVar80 = uVar76; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000
                      ) {
                    lVar73 = lVar73 + 1;
                  }
                }
              }
            }
          }
          bVar75 = false;
        }
      }
    }
LAB_01a54dac:
    if (8 < iVar13) {
      local_420 = vpbroadcastd_avx512vl();
      local_380 = 1.0 / (float)local_500._0_4_;
      local_500 = vpbroadcastd_avx512vl();
      local_4e0 = auVar193._0_32_;
      fStack_37c = local_380;
      fStack_378 = local_380;
      fStack_374 = local_380;
      fStack_370 = local_380;
      fStack_36c = local_380;
      fStack_368 = local_380;
      fStack_364 = local_380;
      local_360 = uVar174;
      uStack_35c = uVar174;
      uStack_358 = uVar174;
      uStack_354 = uVar174;
      uStack_350 = uVar174;
      uStack_34c = uVar174;
      uStack_348 = uVar174;
      uStack_344 = uVar174;
      fStack_29c = local_2a0;
      fStack_298 = local_2a0;
      fStack_294 = local_2a0;
      fStack_290 = local_2a0;
      fStack_28c = local_2a0;
      fStack_288 = local_2a0;
      fStack_284 = local_2a0;
      for (lVar73 = 8; lVar73 < iVar13; lVar73 = lVar73 + 8) {
        auVar99 = vpbroadcastd_avx512vl();
        auVar98 = vpor_avx2(auVar99,_DAT_01fb4ba0);
        uVar24 = vpcmpd_avx512vl(auVar98,local_420,1);
        auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar73 * 4 + lVar77);
        auVar95 = *(undefined1 (*) [32])(lVar77 + 0x22047f0 + lVar73 * 4);
        auVar96 = *(undefined1 (*) [32])(lVar77 + 0x2204c74 + lVar73 * 4);
        auVar97 = *(undefined1 (*) [32])(lVar77 + 0x22050f8 + lVar73 * 4);
        local_480 = auVar190._0_32_;
        auVar100 = vmulps_avx512vl(local_480,auVar97);
        local_4a0 = auVar191._0_32_;
        auVar108 = vmulps_avx512vl(local_4a0,auVar97);
        auVar48._4_4_ = auVar97._4_4_ * (float)local_100._4_4_;
        auVar48._0_4_ = auVar97._0_4_ * (float)local_100._0_4_;
        auVar48._8_4_ = auVar97._8_4_ * fStack_f8;
        auVar48._12_4_ = auVar97._12_4_ * fStack_f4;
        auVar48._16_4_ = auVar97._16_4_ * fStack_f0;
        auVar48._20_4_ = auVar97._20_4_ * fStack_ec;
        auVar48._24_4_ = auVar97._24_4_ * fStack_e8;
        auVar48._28_4_ = auVar98._28_4_;
        auVar106 = auVar184._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar100,auVar96,auVar106);
        local_4c0 = auVar189._0_32_;
        auVar100 = vfmadd231ps_avx512vl(auVar108,auVar96,local_4c0);
        auVar108 = vfmadd231ps_avx512vl(auVar48,auVar96,local_e0);
        auVar168 = auVar188._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar168);
        auVar178 = auVar193._0_32_;
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,auVar178);
        auVar85 = vfmadd231ps_fma(auVar108,auVar95,local_c0);
        local_3c0 = auVar186._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar98,auVar99,local_3c0);
        local_3e0 = auVar187._0_32_;
        auVar94 = vfmadd231ps_avx512vl(auVar100,auVar99,local_3e0);
        auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar73 * 4 + lVar77);
        auVar100 = *(undefined1 (*) [32])(lVar77 + 0x2206c10 + lVar73 * 4);
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar99,local_a0);
        auVar108 = *(undefined1 (*) [32])(lVar77 + 0x2207094 + lVar73 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar77 + 0x2207518 + lVar73 * 4);
        auVar101 = vmulps_avx512vl(local_480,auVar107);
        auVar102 = vmulps_avx512vl(local_4a0,auVar107);
        auVar49._4_4_ = auVar107._4_4_ * (float)local_100._4_4_;
        auVar49._0_4_ = auVar107._0_4_ * (float)local_100._0_4_;
        auVar49._8_4_ = auVar107._8_4_ * fStack_f8;
        auVar49._12_4_ = auVar107._12_4_ * fStack_f4;
        auVar49._16_4_ = auVar107._16_4_ * fStack_f0;
        auVar49._20_4_ = auVar107._20_4_ * fStack_ec;
        auVar49._24_4_ = auVar107._24_4_ * fStack_e8;
        auVar49._28_4_ = uStack_e4;
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,auVar106);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,local_4c0);
        auVar91 = vfmadd231ps_avx512vl(auVar49,auVar108,local_e0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar168);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar178);
        auVar84 = vfmadd231ps_fma(auVar91,auVar100,local_c0);
        auVar91 = vfmadd231ps_avx512vl(auVar101,auVar98,local_3c0);
        auVar92 = vfmadd231ps_avx512vl(auVar102,auVar98,local_3e0);
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar98,local_a0);
        auVar103 = vmaxps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar84));
        auVar101 = vsubps_avx(auVar91,auVar93);
        auVar102 = vsubps_avx(auVar92,auVar94);
        auVar104 = vmulps_avx512vl(auVar94,auVar101);
        auVar105 = vmulps_avx512vl(auVar93,auVar102);
        auVar104 = vsubps_avx512vl(auVar104,auVar105);
        auVar105 = vmulps_avx512vl(auVar102,auVar102);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar101);
        auVar103 = vmulps_avx512vl(auVar103,auVar103);
        auVar103 = vmulps_avx512vl(auVar103,auVar105);
        auVar104 = vmulps_avx512vl(auVar104,auVar104);
        uVar144 = vcmpps_avx512vl(auVar104,auVar103,2);
        bVar79 = (byte)uVar24 & (byte)uVar144;
        if (bVar79 == 0) {
          auVar193 = ZEXT3264(auVar178);
          auVar184 = ZEXT3264(auVar106);
        }
        else {
          auVar107 = vmulps_avx512vl(local_460,auVar107);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_160,auVar107);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar108);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_120,auVar100);
          auVar97 = vmulps_avx512vl(local_460,auVar97);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar97);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar96);
          auVar100 = vfmadd213ps_avx512vl(auVar99,local_120,auVar95);
          auVar99 = *(undefined1 (*) [32])(lVar77 + 0x220557c + lVar73 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar77 + 0x2205a00 + lVar73 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar77 + 0x2205e84 + lVar73 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar77 + 0x2206308 + lVar73 * 4);
          auVar108 = vmulps_avx512vl(local_480,auVar97);
          auVar107 = vmulps_avx512vl(local_4a0,auVar97);
          auVar97 = vmulps_avx512vl(local_460,auVar97);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar96,auVar106);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar96,local_4c0);
          auVar96 = vfmadd231ps_avx512vl(auVar97,local_160,auVar96);
          auVar97 = vfmadd231ps_avx512vl(auVar108,auVar95,auVar168);
          auVar108 = vfmadd231ps_avx512vl(auVar107,auVar95,auVar178);
          auVar95 = vfmadd231ps_avx512vl(auVar96,local_140,auVar95);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,local_3c0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar99,local_3e0);
          auVar107 = vfmadd231ps_avx512vl(auVar95,local_120,auVar99);
          auVar99 = *(undefined1 (*) [32])(lVar77 + 0x220799c + lVar73 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar77 + 0x22082a4 + lVar73 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar77 + 0x2208728 + lVar73 * 4);
          auVar103 = vmulps_avx512vl(local_480,auVar96);
          auVar104 = vmulps_avx512vl(local_4a0,auVar96);
          auVar96 = vmulps_avx512vl(local_460,auVar96);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,auVar106);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar95,local_4c0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,local_160,auVar95);
          auVar95 = *(undefined1 (*) [32])(lVar77 + 0x2207e20 + lVar73 * 4);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,auVar168);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar95,auVar178);
          auVar95 = vfmadd231ps_avx512vl(auVar96,local_140,auVar95);
          auVar96 = vfmadd231ps_avx512vl(auVar103,auVar99,local_3c0);
          auVar103 = vfmadd231ps_avx512vl(auVar104,auVar99,local_3e0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,local_120,auVar99);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar97,auVar104);
          vandps_avx512vl(auVar108,auVar104);
          auVar99 = vmaxps_avx(auVar104,auVar104);
          vandps_avx512vl(auVar107,auVar104);
          auVar99 = vmaxps_avx(auVar99,auVar104);
          auVar71._4_4_ = fStack_29c;
          auVar71._0_4_ = local_2a0;
          auVar71._8_4_ = fStack_298;
          auVar71._12_4_ = fStack_294;
          auVar71._16_4_ = fStack_290;
          auVar71._20_4_ = fStack_28c;
          auVar71._24_4_ = fStack_288;
          auVar71._28_4_ = fStack_284;
          uVar80 = vcmpps_avx512vl(auVar99,auVar71,1);
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar120._0_4_ = (float)((uint)bVar16 * auVar101._0_4_ | (uint)!bVar16 * auVar97._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar97._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar97._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar97._12_4_)
          ;
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * auVar97._16_4_)
          ;
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * auVar97._20_4_)
          ;
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * auVar97._24_4_)
          ;
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar120._28_4_ = (uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar97._28_4_;
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar121._0_4_ = (float)((uint)bVar16 * auVar102._0_4_ | (uint)!bVar16 * auVar108._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar108._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar108._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar121._12_4_ =
               (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar108._12_4_);
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar121._16_4_ =
               (float)((uint)bVar16 * auVar102._16_4_ | (uint)!bVar16 * auVar108._16_4_);
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar121._20_4_ =
               (float)((uint)bVar16 * auVar102._20_4_ | (uint)!bVar16 * auVar108._20_4_);
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar121._24_4_ =
               (float)((uint)bVar16 * auVar102._24_4_ | (uint)!bVar16 * auVar108._24_4_);
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar121._28_4_ = (uint)bVar16 * auVar102._28_4_ | (uint)!bVar16 * auVar108._28_4_;
          vandps_avx512vl(auVar96,auVar104);
          vandps_avx512vl(auVar103,auVar104);
          auVar99 = vmaxps_avx(auVar121,auVar121);
          vandps_avx512vl(auVar95,auVar104);
          auVar99 = vmaxps_avx(auVar99,auVar121);
          uVar80 = vcmpps_avx512vl(auVar99,auVar71,1);
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar122._0_4_ = (uint)bVar16 * auVar101._0_4_ | (uint)!bVar16 * auVar96._0_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar96._4_4_;
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar96._8_4_;
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar96._12_4_;
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar122._16_4_ = (uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * auVar96._16_4_;
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar122._20_4_ = (uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * auVar96._20_4_;
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar122._24_4_ = (uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * auVar96._24_4_;
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar122._28_4_ = (uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar96._28_4_;
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar123._0_4_ = (float)((uint)bVar16 * auVar102._0_4_ | (uint)!bVar16 * auVar103._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar103._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar103._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar123._12_4_ =
               (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar103._12_4_);
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar123._16_4_ =
               (float)((uint)bVar16 * auVar102._16_4_ | (uint)!bVar16 * auVar103._16_4_);
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar123._20_4_ =
               (float)((uint)bVar16 * auVar102._20_4_ | (uint)!bVar16 * auVar103._20_4_);
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar123._24_4_ =
               (float)((uint)bVar16 * auVar102._24_4_ | (uint)!bVar16 * auVar103._24_4_);
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar123._28_4_ = (uint)bVar16 * auVar102._28_4_ | (uint)!bVar16 * auVar103._28_4_;
          auVar172._8_4_ = 0x80000000;
          auVar172._0_8_ = 0x8000000080000000;
          auVar172._12_4_ = 0x80000000;
          auVar172._16_4_ = 0x80000000;
          auVar172._20_4_ = 0x80000000;
          auVar172._24_4_ = 0x80000000;
          auVar172._28_4_ = 0x80000000;
          auVar99 = vxorps_avx512vl(auVar122,auVar172);
          auVar103 = auVar185._0_32_;
          auVar95 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar103);
          auVar89 = vfmadd231ps_fma(auVar95,auVar121,auVar121);
          auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
          auVar183._8_4_ = 0xbf000000;
          auVar183._0_8_ = 0xbf000000bf000000;
          auVar183._12_4_ = 0xbf000000;
          auVar183._16_4_ = 0xbf000000;
          auVar183._20_4_ = 0xbf000000;
          auVar183._24_4_ = 0xbf000000;
          auVar183._28_4_ = 0xbf000000;
          fVar150 = auVar95._0_4_;
          fVar138 = auVar95._4_4_;
          fVar142 = auVar95._8_4_;
          fVar143 = auVar95._12_4_;
          fVar165 = auVar95._16_4_;
          fVar166 = auVar95._20_4_;
          fVar81 = auVar95._24_4_;
          auVar50._4_4_ = fVar138 * fVar138 * fVar138 * auVar89._4_4_ * -0.5;
          auVar50._0_4_ = fVar150 * fVar150 * fVar150 * auVar89._0_4_ * -0.5;
          auVar50._8_4_ = fVar142 * fVar142 * fVar142 * auVar89._8_4_ * -0.5;
          auVar50._12_4_ = fVar143 * fVar143 * fVar143 * auVar89._12_4_ * -0.5;
          auVar50._16_4_ = fVar165 * fVar165 * fVar165 * -0.0;
          auVar50._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
          auVar50._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
          auVar50._28_4_ = auVar121._28_4_;
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar95 = vfmadd231ps_avx512vl(auVar50,auVar96,auVar95);
          auVar51._4_4_ = auVar121._4_4_ * auVar95._4_4_;
          auVar51._0_4_ = auVar121._0_4_ * auVar95._0_4_;
          auVar51._8_4_ = auVar121._8_4_ * auVar95._8_4_;
          auVar51._12_4_ = auVar121._12_4_ * auVar95._12_4_;
          auVar51._16_4_ = auVar121._16_4_ * auVar95._16_4_;
          auVar51._20_4_ = auVar121._20_4_ * auVar95._20_4_;
          auVar51._24_4_ = auVar121._24_4_ * auVar95._24_4_;
          auVar51._28_4_ = 0;
          auVar52._4_4_ = auVar95._4_4_ * -auVar120._4_4_;
          auVar52._0_4_ = auVar95._0_4_ * -auVar120._0_4_;
          auVar52._8_4_ = auVar95._8_4_ * -auVar120._8_4_;
          auVar52._12_4_ = auVar95._12_4_ * -auVar120._12_4_;
          auVar52._16_4_ = auVar95._16_4_ * -auVar120._16_4_;
          auVar52._20_4_ = auVar95._20_4_ * -auVar120._20_4_;
          auVar52._24_4_ = auVar95._24_4_ * -auVar120._24_4_;
          auVar52._28_4_ = auVar121._28_4_;
          auVar97 = vmulps_avx512vl(auVar95,auVar103);
          auVar95 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar103);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar123,auVar123);
          auVar108 = vrsqrt14ps_avx512vl(auVar95);
          auVar95 = vmulps_avx512vl(auVar95,auVar183);
          fVar150 = auVar108._0_4_;
          fVar138 = auVar108._4_4_;
          fVar142 = auVar108._8_4_;
          fVar143 = auVar108._12_4_;
          fVar165 = auVar108._16_4_;
          fVar166 = auVar108._20_4_;
          fVar81 = auVar108._24_4_;
          auVar53._4_4_ = fVar138 * fVar138 * fVar138 * auVar95._4_4_;
          auVar53._0_4_ = fVar150 * fVar150 * fVar150 * auVar95._0_4_;
          auVar53._8_4_ = fVar142 * fVar142 * fVar142 * auVar95._8_4_;
          auVar53._12_4_ = fVar143 * fVar143 * fVar143 * auVar95._12_4_;
          auVar53._16_4_ = fVar165 * fVar165 * fVar165 * auVar95._16_4_;
          auVar53._20_4_ = fVar166 * fVar166 * fVar166 * auVar95._20_4_;
          auVar53._24_4_ = fVar81 * fVar81 * fVar81 * auVar95._24_4_;
          auVar53._28_4_ = auVar95._28_4_;
          auVar95 = vfmadd231ps_avx512vl(auVar53,auVar96,auVar108);
          auVar54._4_4_ = auVar123._4_4_ * auVar95._4_4_;
          auVar54._0_4_ = auVar123._0_4_ * auVar95._0_4_;
          auVar54._8_4_ = auVar123._8_4_ * auVar95._8_4_;
          auVar54._12_4_ = auVar123._12_4_ * auVar95._12_4_;
          auVar54._16_4_ = auVar123._16_4_ * auVar95._16_4_;
          auVar54._20_4_ = auVar123._20_4_ * auVar95._20_4_;
          auVar54._24_4_ = auVar123._24_4_ * auVar95._24_4_;
          auVar54._28_4_ = auVar108._28_4_;
          auVar55._4_4_ = auVar95._4_4_ * auVar99._4_4_;
          auVar55._0_4_ = auVar95._0_4_ * auVar99._0_4_;
          auVar55._8_4_ = auVar95._8_4_ * auVar99._8_4_;
          auVar55._12_4_ = auVar95._12_4_ * auVar99._12_4_;
          auVar55._16_4_ = auVar95._16_4_ * auVar99._16_4_;
          auVar55._20_4_ = auVar95._20_4_ * auVar99._20_4_;
          auVar55._24_4_ = auVar95._24_4_ * auVar99._24_4_;
          auVar55._28_4_ = auVar99._28_4_;
          auVar99 = vmulps_avx512vl(auVar95,auVar103);
          auVar89 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar85),auVar93);
          auVar95 = ZEXT1632(auVar85);
          auVar83 = vfmadd213ps_fma(auVar52,auVar95,auVar94);
          auVar96 = vfmadd213ps_avx512vl(auVar97,auVar95,auVar100);
          auVar108 = vfmadd213ps_avx512vl(auVar54,ZEXT1632(auVar84),auVar91);
          auVar86 = vfnmadd213ps_fma(auVar51,auVar95,auVar93);
          auVar107 = ZEXT1632(auVar84);
          auVar9 = vfmadd213ps_fma(auVar55,auVar107,auVar92);
          auVar22 = vfnmadd213ps_fma(auVar52,auVar95,auVar94);
          auVar10 = vfmadd213ps_fma(auVar99,auVar107,auVar98);
          auVar94 = ZEXT1632(auVar85);
          auVar147 = vfnmadd231ps_fma(auVar100,auVar94,auVar97);
          auVar23 = vfnmadd213ps_fma(auVar54,auVar107,auVar91);
          auVar146 = vfnmadd213ps_fma(auVar55,auVar107,auVar92);
          auVar87 = vfnmadd231ps_fma(auVar98,ZEXT1632(auVar84),auVar99);
          auVar98 = vsubps_avx512vl(auVar108,ZEXT1632(auVar86));
          auVar99 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar22));
          auVar95 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar147));
          auVar56._4_4_ = auVar99._4_4_ * auVar147._4_4_;
          auVar56._0_4_ = auVar99._0_4_ * auVar147._0_4_;
          auVar56._8_4_ = auVar99._8_4_ * auVar147._8_4_;
          auVar56._12_4_ = auVar99._12_4_ * auVar147._12_4_;
          auVar56._16_4_ = auVar99._16_4_ * 0.0;
          auVar56._20_4_ = auVar99._20_4_ * 0.0;
          auVar56._24_4_ = auVar99._24_4_ * 0.0;
          auVar56._28_4_ = auVar97._28_4_;
          auVar85 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar22),auVar95);
          auVar57._4_4_ = auVar95._4_4_ * auVar86._4_4_;
          auVar57._0_4_ = auVar95._0_4_ * auVar86._0_4_;
          auVar57._8_4_ = auVar95._8_4_ * auVar86._8_4_;
          auVar57._12_4_ = auVar95._12_4_ * auVar86._12_4_;
          auVar57._16_4_ = auVar95._16_4_ * 0.0;
          auVar57._20_4_ = auVar95._20_4_ * 0.0;
          auVar57._24_4_ = auVar95._24_4_ * 0.0;
          auVar57._28_4_ = auVar95._28_4_;
          auVar11 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar147),auVar98);
          auVar58._4_4_ = auVar22._4_4_ * auVar98._4_4_;
          auVar58._0_4_ = auVar22._0_4_ * auVar98._0_4_;
          auVar58._8_4_ = auVar22._8_4_ * auVar98._8_4_;
          auVar58._12_4_ = auVar22._12_4_ * auVar98._12_4_;
          auVar58._16_4_ = auVar98._16_4_ * 0.0;
          auVar58._20_4_ = auVar98._20_4_ * 0.0;
          auVar58._24_4_ = auVar98._24_4_ * 0.0;
          auVar58._28_4_ = auVar98._28_4_;
          auVar12 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar86),auVar99);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar12),auVar103,ZEXT1632(auVar11));
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,ZEXT1632(auVar85));
          uVar80 = vcmpps_avx512vl(auVar99,auVar103,2);
          bVar72 = (byte)uVar80;
          fVar130 = (float)((uint)(bVar72 & 1) * auVar89._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * auVar23._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          fVar132 = (float)((uint)bVar16 * auVar89._4_4_ | (uint)!bVar16 * auVar23._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          fVar135 = (float)((uint)bVar16 * auVar89._8_4_ | (uint)!bVar16 * auVar23._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          fVar136 = (float)((uint)bVar16 * auVar89._12_4_ | (uint)!bVar16 * auVar23._12_4_);
          auVar107 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar135,CONCAT44(fVar132,fVar130))));
          fVar131 = (float)((uint)(bVar72 & 1) * auVar83._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * auVar146._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          fVar134 = (float)((uint)bVar16 * auVar83._4_4_ | (uint)!bVar16 * auVar146._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          fVar133 = (float)((uint)bVar16 * auVar83._8_4_ | (uint)!bVar16 * auVar146._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          fVar137 = (float)((uint)bVar16 * auVar83._12_4_ | (uint)!bVar16 * auVar146._12_4_);
          auVar101 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar133,CONCAT44(fVar134,fVar131))));
          auVar124._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar96._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar87._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar87._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar87._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar87._12_4_);
          fVar150 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar96._16_4_);
          auVar124._16_4_ = fVar150;
          fVar138 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar96._20_4_);
          auVar124._20_4_ = fVar138;
          fVar142 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar96._24_4_);
          auVar124._24_4_ = fVar142;
          iVar2 = (uint)(byte)(uVar80 >> 7) * auVar96._28_4_;
          auVar124._28_4_ = iVar2;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar86),auVar108);
          auVar125._0_4_ =
               (uint)(bVar72 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar85._0_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar16 * auVar99._4_4_ | (uint)!bVar16 * auVar85._4_4_;
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar16 * auVar99._8_4_ | (uint)!bVar16 * auVar85._8_4_;
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar16 * auVar99._12_4_ | (uint)!bVar16 * auVar85._12_4_;
          auVar125._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar99._16_4_;
          auVar125._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar99._20_4_;
          auVar125._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar99._24_4_;
          auVar125._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar9));
          auVar126._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar89._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar16 * auVar99._4_4_ | (uint)!bVar16 * auVar89._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar16 * auVar99._8_4_ | (uint)!bVar16 * auVar89._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar16 * auVar99._12_4_ | (uint)!bVar16 * auVar89._12_4_);
          fVar143 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar99._16_4_);
          auVar126._16_4_ = fVar143;
          fVar165 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar99._20_4_);
          auVar126._20_4_ = fVar165;
          fVar166 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar99._24_4_);
          auVar126._24_4_ = fVar166;
          auVar126._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar147),ZEXT1632(auVar10));
          auVar127._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar83._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar16 * auVar99._4_4_ | (uint)!bVar16 * auVar83._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar16 * auVar99._8_4_ | (uint)!bVar16 * auVar83._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar16 * auVar99._12_4_ | (uint)!bVar16 * auVar83._12_4_);
          fVar81 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar99._16_4_);
          auVar127._16_4_ = fVar81;
          fVar149 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar99._20_4_);
          auVar127._20_4_ = fVar149;
          fVar82 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar99._24_4_);
          auVar127._24_4_ = fVar82;
          iVar3 = (uint)(byte)(uVar80 >> 7) * auVar99._28_4_;
          auVar127._28_4_ = iVar3;
          auVar128._0_4_ =
               (uint)(bVar72 & 1) * (int)auVar86._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar108._0_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar16 * (int)auVar86._4_4_ | (uint)!bVar16 * auVar108._4_4_;
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar16 * (int)auVar86._8_4_ | (uint)!bVar16 * auVar108._8_4_;
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar16 * (int)auVar86._12_4_ | (uint)!bVar16 * auVar108._12_4_;
          auVar128._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar108._16_4_;
          auVar128._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar108._20_4_;
          auVar128._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar108._24_4_;
          auVar128._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar108._28_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar80 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar80 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar108 = vsubps_avx512vl(auVar128,auVar107);
          auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar22._12_4_ |
                                                  (uint)!bVar20 * auVar9._12_4_,
                                                  CONCAT48((uint)bVar19 * (int)auVar22._8_4_ |
                                                           (uint)!bVar19 * auVar9._8_4_,
                                                           CONCAT44((uint)bVar16 *
                                                                    (int)auVar22._4_4_ |
                                                                    (uint)!bVar16 * auVar9._4_4_,
                                                                    (uint)(bVar72 & 1) *
                                                                    (int)auVar22._0_4_ |
                                                                    (uint)!(bool)(bVar72 & 1) *
                                                                    auVar9._0_4_)))),auVar101);
          auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar147._12_4_ |
                                                  (uint)!bVar21 * auVar10._12_4_,
                                                  CONCAT48((uint)bVar18 * (int)auVar147._8_4_ |
                                                           (uint)!bVar18 * auVar10._8_4_,
                                                           CONCAT44((uint)bVar17 *
                                                                    (int)auVar147._4_4_ |
                                                                    (uint)!bVar17 * auVar10._4_4_,
                                                                    (uint)(bVar72 & 1) *
                                                                    (int)auVar147._0_4_ |
                                                                    (uint)!(bool)(bVar72 & 1) *
                                                                    auVar10._0_4_)))),auVar124);
          auVar97 = vsubps_avx(auVar107,auVar125);
          auVar98 = vsubps_avx(auVar101,auVar126);
          auVar100 = vsubps_avx(auVar124,auVar127);
          auVar59._4_4_ = auVar96._4_4_ * fVar132;
          auVar59._0_4_ = auVar96._0_4_ * fVar130;
          auVar59._8_4_ = auVar96._8_4_ * fVar135;
          auVar59._12_4_ = auVar96._12_4_ * fVar136;
          auVar59._16_4_ = auVar96._16_4_ * 0.0;
          auVar59._20_4_ = auVar96._20_4_ * 0.0;
          auVar59._24_4_ = auVar96._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar59,auVar124,auVar108);
          auVar157._0_4_ = fVar131 * auVar108._0_4_;
          auVar157._4_4_ = fVar134 * auVar108._4_4_;
          auVar157._8_4_ = fVar133 * auVar108._8_4_;
          auVar157._12_4_ = fVar137 * auVar108._12_4_;
          auVar157._16_4_ = auVar108._16_4_ * 0.0;
          auVar157._20_4_ = auVar108._20_4_ * 0.0;
          auVar157._24_4_ = auVar108._24_4_ * 0.0;
          auVar157._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar157,auVar107,auVar95);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar103,ZEXT1632(auVar85));
          auVar161._0_4_ = auVar95._0_4_ * auVar124._0_4_;
          auVar161._4_4_ = auVar95._4_4_ * auVar124._4_4_;
          auVar161._8_4_ = auVar95._8_4_ * auVar124._8_4_;
          auVar161._12_4_ = auVar95._12_4_ * auVar124._12_4_;
          auVar161._16_4_ = auVar95._16_4_ * fVar150;
          auVar161._20_4_ = auVar95._20_4_ * fVar138;
          auVar161._24_4_ = auVar95._24_4_ * fVar142;
          auVar161._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar161,auVar101,auVar96);
          auVar102 = vfmadd231ps_avx512vl(auVar99,auVar103,ZEXT1632(auVar85));
          auVar99 = vmulps_avx512vl(auVar100,auVar125);
          auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar127);
          auVar60._4_4_ = auVar98._4_4_ * auVar127._4_4_;
          auVar60._0_4_ = auVar98._0_4_ * auVar127._0_4_;
          auVar60._8_4_ = auVar98._8_4_ * auVar127._8_4_;
          auVar60._12_4_ = auVar98._12_4_ * auVar127._12_4_;
          auVar60._16_4_ = auVar98._16_4_ * fVar81;
          auVar60._20_4_ = auVar98._20_4_ * fVar149;
          auVar60._24_4_ = auVar98._24_4_ * fVar82;
          auVar60._28_4_ = iVar3;
          auVar85 = vfmsub231ps_fma(auVar60,auVar126,auVar100);
          auVar162._0_4_ = auVar126._0_4_ * auVar97._0_4_;
          auVar162._4_4_ = auVar126._4_4_ * auVar97._4_4_;
          auVar162._8_4_ = auVar126._8_4_ * auVar97._8_4_;
          auVar162._12_4_ = auVar126._12_4_ * auVar97._12_4_;
          auVar162._16_4_ = fVar143 * auVar97._16_4_;
          auVar162._20_4_ = fVar165 * auVar97._20_4_;
          auVar162._24_4_ = fVar166 * auVar97._24_4_;
          auVar162._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar162,auVar98,auVar125);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar103,auVar99);
          auVar93 = vfmadd231ps_avx512vl(auVar99,auVar103,ZEXT1632(auVar85));
          auVar99 = vmaxps_avx(auVar102,auVar93);
          uVar144 = vcmpps_avx512vl(auVar99,auVar103,2);
          bVar79 = bVar79 & (byte)uVar144;
          if (bVar79 != 0) {
            auVar61._4_4_ = auVar100._4_4_ * auVar95._4_4_;
            auVar61._0_4_ = auVar100._0_4_ * auVar95._0_4_;
            auVar61._8_4_ = auVar100._8_4_ * auVar95._8_4_;
            auVar61._12_4_ = auVar100._12_4_ * auVar95._12_4_;
            auVar61._16_4_ = auVar100._16_4_ * auVar95._16_4_;
            auVar61._20_4_ = auVar100._20_4_ * auVar95._20_4_;
            auVar61._24_4_ = auVar100._24_4_ * auVar95._24_4_;
            auVar61._28_4_ = auVar99._28_4_;
            auVar83 = vfmsub231ps_fma(auVar61,auVar98,auVar96);
            auVar62._4_4_ = auVar96._4_4_ * auVar97._4_4_;
            auVar62._0_4_ = auVar96._0_4_ * auVar97._0_4_;
            auVar62._8_4_ = auVar96._8_4_ * auVar97._8_4_;
            auVar62._12_4_ = auVar96._12_4_ * auVar97._12_4_;
            auVar62._16_4_ = auVar96._16_4_ * auVar97._16_4_;
            auVar62._20_4_ = auVar96._20_4_ * auVar97._20_4_;
            auVar62._24_4_ = auVar96._24_4_ * auVar97._24_4_;
            auVar62._28_4_ = auVar96._28_4_;
            auVar89 = vfmsub231ps_fma(auVar62,auVar108,auVar100);
            auVar63._4_4_ = auVar98._4_4_ * auVar108._4_4_;
            auVar63._0_4_ = auVar98._0_4_ * auVar108._0_4_;
            auVar63._8_4_ = auVar98._8_4_ * auVar108._8_4_;
            auVar63._12_4_ = auVar98._12_4_ * auVar108._12_4_;
            auVar63._16_4_ = auVar98._16_4_ * auVar108._16_4_;
            auVar63._20_4_ = auVar98._20_4_ * auVar108._20_4_;
            auVar63._24_4_ = auVar98._24_4_ * auVar108._24_4_;
            auVar63._28_4_ = auVar98._28_4_;
            auVar9 = vfmsub231ps_fma(auVar63,auVar97,auVar95);
            auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar9));
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar83),auVar103);
            auVar95 = vrcp14ps_avx512vl(auVar99);
            auVar97 = auVar192._0_32_;
            auVar96 = vfnmadd213ps_avx512vl(auVar95,auVar99,auVar97);
            auVar85 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
            auVar64._4_4_ = auVar9._4_4_ * auVar124._4_4_;
            auVar64._0_4_ = auVar9._0_4_ * auVar124._0_4_;
            auVar64._8_4_ = auVar9._8_4_ * auVar124._8_4_;
            auVar64._12_4_ = auVar9._12_4_ * auVar124._12_4_;
            auVar64._16_4_ = fVar150 * 0.0;
            auVar64._20_4_ = fVar138 * 0.0;
            auVar64._24_4_ = fVar142 * 0.0;
            auVar64._28_4_ = iVar2;
            auVar89 = vfmadd231ps_fma(auVar64,auVar101,ZEXT1632(auVar89));
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar107,ZEXT1632(auVar83));
            fVar150 = auVar85._0_4_;
            fVar138 = auVar85._4_4_;
            fVar142 = auVar85._8_4_;
            fVar143 = auVar85._12_4_;
            local_240 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar143,
                                           CONCAT48(auVar89._8_4_ * fVar142,
                                                    CONCAT44(auVar89._4_4_ * fVar138,
                                                             auVar89._0_4_ * fVar150))));
            auVar70._4_4_ = uStack_35c;
            auVar70._0_4_ = local_360;
            auVar70._8_4_ = uStack_358;
            auVar70._12_4_ = uStack_354;
            auVar70._16_4_ = uStack_350;
            auVar70._20_4_ = uStack_34c;
            auVar70._24_4_ = uStack_348;
            auVar70._28_4_ = uStack_344;
            uVar144 = vcmpps_avx512vl(local_240,auVar70,0xd);
            uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar29._4_4_ = uVar139;
            auVar29._0_4_ = uVar139;
            auVar29._8_4_ = uVar139;
            auVar29._12_4_ = uVar139;
            auVar29._16_4_ = uVar139;
            auVar29._20_4_ = uVar139;
            auVar29._24_4_ = uVar139;
            auVar29._28_4_ = uVar139;
            uVar24 = vcmpps_avx512vl(local_240,auVar29,2);
            bVar79 = (byte)uVar144 & (byte)uVar24 & bVar79;
            if (bVar79 != 0) {
              uVar144 = vcmpps_avx512vl(auVar99,auVar103,4);
              bVar79 = bVar79 & (byte)uVar144;
              auVar180 = ZEXT1664(local_5c0);
              auVar193 = ZEXT3264(local_4e0);
              auVar184 = ZEXT3264(local_540);
              if (bVar79 != 0) {
                fVar165 = auVar102._0_4_ * fVar150;
                fVar166 = auVar102._4_4_ * fVar138;
                auVar65._4_4_ = fVar166;
                auVar65._0_4_ = fVar165;
                fVar81 = auVar102._8_4_ * fVar142;
                auVar65._8_4_ = fVar81;
                fVar82 = auVar102._12_4_ * fVar143;
                auVar65._12_4_ = fVar82;
                fVar149 = auVar102._16_4_ * 0.0;
                auVar65._16_4_ = fVar149;
                fVar130 = auVar102._20_4_ * 0.0;
                auVar65._20_4_ = fVar130;
                fVar131 = auVar102._24_4_ * 0.0;
                auVar65._24_4_ = fVar131;
                auVar65._28_4_ = auVar99._28_4_;
                auVar95 = vsubps_avx512vl(auVar97,auVar65);
                local_280._0_4_ =
                     (float)((uint)(bVar72 & 1) * (int)fVar165 |
                            (uint)!(bool)(bVar72 & 1) * auVar95._0_4_);
                bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar16 * (int)fVar166 | (uint)!bVar16 * auVar95._4_4_);
                bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar16 * (int)fVar81 | (uint)!bVar16 * auVar95._8_4_);
                bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar16 * (int)fVar82 | (uint)!bVar16 * auVar95._12_4_);
                bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar16 * (int)fVar149 | (uint)!bVar16 * auVar95._16_4_);
                bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar16 * (int)fVar130 | (uint)!bVar16 * auVar95._20_4_);
                bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar16 * (int)fVar131 | (uint)!bVar16 * auVar95._24_4_);
                bVar16 = SUB81(uVar80 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar16 * auVar99._28_4_ | (uint)!bVar16 * auVar95._28_4_);
                auVar99 = vsubps_avx(ZEXT1632(auVar84),auVar94);
                auVar85 = vfmadd213ps_fma(auVar99,local_280,auVar94);
                uVar139 = *(undefined4 *)((long)local_578->ray_space + k * 4 + -0x10);
                auVar30._4_4_ = uVar139;
                auVar30._0_4_ = uVar139;
                auVar30._8_4_ = uVar139;
                auVar30._12_4_ = uVar139;
                auVar30._16_4_ = uVar139;
                auVar30._20_4_ = uVar139;
                auVar30._24_4_ = uVar139;
                auVar30._28_4_ = uVar139;
                auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                             CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                                      CONCAT44(auVar85._4_4_ +
                                                                               auVar85._4_4_,
                                                                               auVar85._0_4_ +
                                                                               auVar85._0_4_)))),
                                          auVar30);
                uVar144 = vcmpps_avx512vl(local_240,auVar99,6);
                if (((byte)uVar144 & bVar79) != 0) {
                  auVar145._0_4_ = auVar93._0_4_ * fVar150;
                  auVar145._4_4_ = auVar93._4_4_ * fVar138;
                  auVar145._8_4_ = auVar93._8_4_ * fVar142;
                  auVar145._12_4_ = auVar93._12_4_ * fVar143;
                  auVar145._16_4_ = auVar93._16_4_ * 0.0;
                  auVar145._20_4_ = auVar93._20_4_ * 0.0;
                  auVar145._24_4_ = auVar93._24_4_ * 0.0;
                  auVar145._28_4_ = 0;
                  auVar99 = vsubps_avx512vl(auVar97,auVar145);
                  auVar129._0_4_ =
                       (uint)(bVar72 & 1) * (int)auVar145._0_4_ |
                       (uint)!(bool)(bVar72 & 1) * auVar99._0_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
                  auVar129._4_4_ =
                       (uint)bVar16 * (int)auVar145._4_4_ | (uint)!bVar16 * auVar99._4_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                  auVar129._8_4_ =
                       (uint)bVar16 * (int)auVar145._8_4_ | (uint)!bVar16 * auVar99._8_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
                  auVar129._12_4_ =
                       (uint)bVar16 * (int)auVar145._12_4_ | (uint)!bVar16 * auVar99._12_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
                  auVar129._16_4_ =
                       (uint)bVar16 * (int)auVar145._16_4_ | (uint)!bVar16 * auVar99._16_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                  auVar129._20_4_ =
                       (uint)bVar16 * (int)auVar145._20_4_ | (uint)!bVar16 * auVar99._20_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
                  auVar129._24_4_ =
                       (uint)bVar16 * (int)auVar145._24_4_ | (uint)!bVar16 * auVar99._24_4_;
                  auVar129._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar99._28_4_;
                  auVar31._8_4_ = 0x40000000;
                  auVar31._0_8_ = 0x4000000040000000;
                  auVar31._12_4_ = 0x40000000;
                  auVar31._16_4_ = 0x40000000;
                  auVar31._20_4_ = 0x40000000;
                  auVar31._24_4_ = 0x40000000;
                  auVar31._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar129,auVar97,auVar31);
                  local_220 = (undefined4)lVar73;
                  local_210 = local_5c0;
                  local_200 = local_5a0;
                  uStack_1f8 = uStack_598;
                  local_1f0 = local_5b0;
                  uStack_1e8 = uStack_5a8;
                  pGVar14 = (context->scene->geometries).items[local_5c8].ptr;
                  if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar72 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar72 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar85 = vcvtsi2ss_avx512f(auVar104._0_16_,local_220);
                    fVar150 = auVar85._0_4_;
                    local_1c0[0] = (fVar150 + local_280._0_4_ + 0.0) * local_380;
                    local_1c0[1] = (fVar150 + local_280._4_4_ + 1.0) * fStack_37c;
                    local_1c0[2] = (fVar150 + local_280._8_4_ + 2.0) * fStack_378;
                    local_1c0[3] = (fVar150 + local_280._12_4_ + 3.0) * fStack_374;
                    fStack_1b0 = (fVar150 + local_280._16_4_ + 4.0) * fStack_370;
                    fStack_1ac = (fVar150 + local_280._20_4_ + 5.0) * fStack_36c;
                    fStack_1a8 = (fVar150 + local_280._24_4_ + 6.0) * fStack_368;
                    fStack_1a4 = fVar150 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    uVar80 = 0;
                    uVar74 = (ulong)((byte)uVar144 & bVar79);
                    for (uVar76 = uVar74; local_580 = pGVar14, local_21c = iVar13, (uVar76 & 1) == 0
                        ; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                      uVar80 = uVar80 + 1;
                    }
                    while (auVar85 = auVar185._0_16_, uVar74 != 0) {
                      uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
                      fVar150 = local_1c0[uVar80];
                      local_300._4_4_ = fVar150;
                      local_300._0_4_ = fVar150;
                      local_300._8_4_ = fVar150;
                      local_300._12_4_ = fVar150;
                      local_2f0 = *(undefined4 *)(local_1a0 + uVar80 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar80 * 4);
                      local_570.context = context->user;
                      fVar138 = 1.0 - fVar150;
                      auVar83 = vfnmadd231ss_fma(ZEXT416((uint)(fVar150 * (fVar138 + fVar138))),
                                                 ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
                      auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_300,
                                                ZEXT416(0xc0a00000));
                      auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * 3.0)),
                                                ZEXT416((uint)(fVar150 + fVar150)),auVar85);
                      auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_300,
                                                ZEXT416(0x40000000));
                      auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138 * -3.0)),
                                                ZEXT416((uint)(fVar138 + fVar138)),auVar85);
                      auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),local_300,
                                                ZEXT416((uint)(fVar138 * -2.0)));
                      fVar150 = auVar83._0_4_ * 0.5;
                      fVar138 = auVar84._0_4_ * 0.5;
                      fVar142 = auVar85._0_4_ * 0.5;
                      fVar143 = auVar89._0_4_ * 0.5;
                      auVar154._0_4_ = fVar143 * local_4f0;
                      auVar154._4_4_ = fVar143 * fStack_4ec;
                      auVar154._8_4_ = fVar143 * fStack_4e8;
                      auVar154._12_4_ = fVar143 * fStack_4e4;
                      auVar164._4_4_ = fVar142;
                      auVar164._0_4_ = fVar142;
                      auVar164._8_4_ = fVar142;
                      auVar164._12_4_ = fVar142;
                      auVar67._8_8_ = uStack_5a8;
                      auVar67._0_8_ = local_5b0;
                      auVar85 = vfmadd132ps_fma(auVar164,auVar154,auVar67);
                      auVar155._4_4_ = fVar138;
                      auVar155._0_4_ = fVar138;
                      auVar155._8_4_ = fVar138;
                      auVar155._12_4_ = fVar138;
                      auVar69._8_8_ = uStack_598;
                      auVar69._0_8_ = local_5a0;
                      auVar85 = vfmadd132ps_fma(auVar155,auVar85,auVar69);
                      auVar141._4_4_ = fVar150;
                      auVar141._0_4_ = fVar150;
                      auVar141._8_4_ = fVar150;
                      auVar141._12_4_ = fVar150;
                      auVar85 = vfmadd213ps_fma(auVar141,auVar180._0_16_,auVar85);
                      local_330 = auVar85._0_4_;
                      local_320 = vshufps_avx(auVar85,auVar85,0x55);
                      local_310 = vshufps_avx(auVar85,auVar85,0xaa);
                      local_2e0 = local_390._0_8_;
                      uStack_2d8 = local_390._8_8_;
                      local_2d0 = local_500;
                      vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                      uStack_2bc = (local_570.context)->instID[0];
                      local_2c0 = uStack_2bc;
                      uStack_2b8 = uStack_2bc;
                      uStack_2b4 = uStack_2bc;
                      uStack_2b0 = (local_570.context)->instPrimID[0];
                      uStack_2ac = uStack_2b0;
                      uStack_2a8 = uStack_2b0;
                      uStack_2a4 = uStack_2b0;
                      local_5e0 = local_3a0;
                      local_570.valid = (int *)local_5e0;
                      local_570.geometryUserPtr = local_580->userPtr;
                      local_570.hit = (RTCHitN *)&local_330;
                      local_570.N = 4;
                      local_510._0_8_ = uVar74;
                      local_590._0_8_ = uVar80;
                      uVar76 = uVar80;
                      local_570.ray = (RTCRayN *)ray;
                      uStack_32c = local_330;
                      uStack_328 = local_330;
                      uStack_324 = local_330;
                      uStack_2ec = local_2f0;
                      uStack_2e8 = local_2f0;
                      uStack_2e4 = local_2f0;
                      if (local_580->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*local_580->occlusionFilterN)(&local_570);
                        auVar180 = ZEXT1664(local_5c0);
                        uVar74 = local_510._0_8_;
                        uVar76 = local_590._0_8_;
                      }
                      uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                      if ((uVar80 & 0xf) != 0) {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((local_580->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_570);
                          auVar180 = ZEXT1664(local_5c0);
                          uVar74 = local_510._0_8_;
                          uVar76 = local_590._0_8_;
                        }
                        auVar85 = auVar185._0_16_;
                        auVar84 = *(undefined1 (*) [16])(local_570.ray + 0x80);
                        uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                        uVar80 = uVar80 & 0xf;
                        auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar16 = (bool)((byte)uVar80 & 1);
                        auVar90._0_4_ = (uint)bVar16 * auVar89._0_4_ | (uint)!bVar16 * auVar84._0_4_
                        ;
                        bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
                        auVar90._4_4_ = (uint)bVar16 * auVar89._4_4_ | (uint)!bVar16 * auVar84._4_4_
                        ;
                        bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                        auVar90._8_4_ = (uint)bVar16 * auVar89._8_4_ | (uint)!bVar16 * auVar84._8_4_
                        ;
                        bVar16 = SUB81(uVar80 >> 3,0);
                        auVar90._12_4_ =
                             (uint)bVar16 * auVar89._12_4_ | (uint)!bVar16 * auVar84._12_4_;
                        *(undefined1 (*) [16])(local_570.ray + 0x80) = auVar90;
                        if ((byte)uVar80 != 0) {
                          bVar72 = 1;
                          goto LAB_01a55876;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar139;
                      uVar80 = 0;
                      uVar74 = uVar74 ^ 1L << (uVar76 & 0x3f);
                      for (uVar76 = uVar74; (uVar76 & 1) == 0;
                          uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                        uVar80 = uVar80 + 1;
                      }
                    }
                    bVar72 = 0;
LAB_01a55876:
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar192 = ZEXT3264(auVar99);
                    auVar85 = vxorps_avx512vl(auVar85,auVar85);
                    auVar185 = ZEXT1664(auVar85);
                    auVar186 = ZEXT3264(local_3c0);
                    auVar187 = ZEXT3264(local_3e0);
                    auVar188 = ZEXT3264(local_400);
                    auVar193 = ZEXT3264(local_4e0);
                    auVar184 = ZEXT3264(local_540);
                    auVar189 = ZEXT3264(local_4c0);
                    auVar190 = ZEXT3264(local_480);
                    auVar191 = ZEXT3264(local_4a0);
                  }
                  bVar75 = (bool)(bVar75 | bVar72);
                }
              }
              goto LAB_01a55855;
            }
          }
          auVar193 = ZEXT3264(local_4e0);
          auVar184 = ZEXT3264(local_540);
        }
LAB_01a55855:
      }
    }
    if (bVar75) break;
    uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar28._4_4_ = uVar139;
    auVar28._0_4_ = uVar139;
    auVar28._8_4_ = uVar139;
    auVar28._12_4_ = uVar139;
    auVar28._16_4_ = uVar139;
    auVar28._20_4_ = uVar139;
    auVar28._24_4_ = uVar139;
    auVar28._28_4_ = uVar139;
    uVar144 = vcmpps_avx512vl(local_80,auVar28,2);
    local_428 = (ulong)((uint)uVar78 & (uint)uVar144);
  }
  return local_428 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }